

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

char * duckdb_yyjson::yyjson_mut_write_opts_impl
                 (yyjson_mut_val *val,usize estimated_val_num,yyjson_write_flag flg,
                 yyjson_alc *alc_ptr,usize *dat_len,yyjson_write_err *err)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  _func_void_ptr_void_ptr_size_t *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint *puVar57;
  uint64_t uVar58;
  char *pcVar59;
  int iVar60;
  char *pcVar61;
  uint *puVar62;
  size_t sVar63;
  ulong uVar64;
  undefined1 *puVar65;
  yyjson_mut_val *pyVar66;
  yyjson_write_err *pyVar67;
  yyjson_write_err *pyVar68;
  undefined2 uVar69;
  uint uVar70;
  int iVar71;
  long lVar72;
  undefined8 uVar73;
  size_t sVar74;
  uint *puVar75;
  yyjson_mut_val *pyVar76;
  size_t sVar77;
  byte bVar78;
  ulong uVar79;
  uint *puVar80;
  byte *pbVar81;
  long lVar82;
  uint uVar83;
  ulong uVar84;
  long lVar85;
  ulong uVar86;
  long lVar87;
  uint uVar88;
  int iVar89;
  undefined2 *puVar90;
  int iVar91;
  undefined **ppuVar92;
  uint uVar93;
  ulong uVar94;
  char cVar95;
  uint uVar96;
  uint uVar97;
  long lVar98;
  ulong uVar99;
  undefined1 *puVar100;
  ulong uVar101;
  ulong *puVar102;
  uint *puVar103;
  uint *puVar104;
  undefined8 *puVar105;
  int iVar106;
  ulong *puVar107;
  ulong uVar108;
  byte *pbVar109;
  bool bVar110;
  bool bVar111;
  yyjson_write_err dummy_err;
  char local_fc;
  byte *local_f8;
  uint local_e8;
  ulong local_e0;
  uint *local_d0;
  ulong *local_90;
  ulong local_78;
  yyjson_mut_val *local_68;
  yyjson_write_err local_60;
  ulong local_50;
  ulong *local_48;
  uint *local_40;
  long local_38;
  
  ppuVar92 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar92 = &alc_ptr->malloc;
  }
  pyVar68 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar68 = &local_60;
  }
  if (val == (yyjson_mut_val *)0x0) {
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar67 = &local_60;
    if (err != (yyjson_write_err *)0x0) {
      pyVar67 = err;
    }
    pyVar67->msg = "input JSON is NULL";
    pyVar68->code = 1;
    return (char *)0x0;
  }
  p_Var4 = ((yyjson_alc *)ppuVar92)->malloc;
  p_Var5 = ((yyjson_alc *)ppuVar92)->free;
  pvVar6 = ((yyjson_alc *)ppuVar92)->ctx;
  uVar84 = val->tag;
  bVar78 = (byte)uVar84;
  local_fc = (char)flg;
  if (0xff < uVar84 && (~bVar78 & 6) == 0) {
    p_Var7 = ((yyjson_alc *)ppuVar92)->realloc;
    if ((flg & 0x41) == 0) {
      if ((flg & 2) == 0) {
        puVar65 = enc_table_cpy;
        puVar100 = enc_table_cpy_slash;
      }
      else {
        puVar65 = enc_table_esc;
        puVar100 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar100 = puVar65;
      }
      lVar98 = estimated_val_num * 9;
      local_e0 = estimated_val_num * 0x12 + 0x4f & 0xfffffffffffffff0;
      local_f8 = (byte *)(*p_Var4)(pvVar6,local_e0);
      if (local_f8 == (byte *)0x0) {
        local_f8 = (byte *)0x0;
LAB_018af7e8:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar67 = &local_60;
        if (err != (yyjson_write_err *)0x0) {
          pyVar67 = err;
        }
        pyVar68->code = 2;
        pyVar67->msg = "memory allocation failed";
        if (local_f8 == (byte *)0x0) {
          return (char *)0x0;
        }
        (*p_Var5)(pvVar6,local_f8);
        return (char *)0x0;
      }
      uVar84 = val->tag;
      uVar70 = (uint)uVar84 & 7;
      bVar111 = uVar70 == 7;
      local_50 = CONCAT71((int7)((ulong)lVar98 >> 8),bVar111);
      *local_f8 = bVar111 << 5 | 0x5b;
      pyVar66 = (yyjson_mut_val *)(val->uni).u64;
      if (uVar70 == 7) {
        pyVar66 = pyVar66->next;
      }
      puVar103 = (uint *)(local_f8 + local_e0);
      puVar75 = (uint *)(local_f8 + 1);
      lVar98 = (uVar84 >> 8) << bVar111;
      local_d0 = puVar103;
      local_68 = val;
LAB_018acba8:
      do {
        uVar84 = local_50 & 0xff;
        pyVar76 = pyVar66;
        puVar62 = puVar103;
        puVar80 = puVar75;
        do {
          pyVar76 = pyVar76->next;
          uVar64 = pyVar76->tag;
          bVar78 = (byte)uVar64 & 7;
          if (bVar78 == 4) {
            if (puVar62 <= puVar80 + 8) {
              uVar64 = local_e0 >> 1;
              if (uVar64 < 0x21) {
                uVar64 = 0x20;
              }
              sVar77 = (uVar64 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar77);
              if (pbVar81 == (byte *)0x0) goto LAB_018af7e8;
              sVar74 = (long)local_d0 - (long)puVar62;
              memmove(pbVar81 + (sVar77 - sVar74),pbVar81 + ((long)puVar62 - (long)local_f8),sVar74)
              ;
              puVar80 = (uint *)(pbVar81 + ((long)puVar80 - (long)local_f8));
              local_d0 = (uint *)(pbVar81 + sVar77);
              uVar64 = pyVar76->tag;
              puVar62 = (uint *)(pbVar81 + (sVar77 - sVar74));
              local_f8 = pbVar81;
              local_e0 = sVar77;
            }
            pcVar59 = (char *)(pyVar76->uni).u64;
            uVar70 = (uint)((ulong)pcVar59 >> 0x20);
            if ((uVar64 & 0x10) == 0) {
              uVar70 = uVar70 >> 0x1f & (uint)(uVar64 >> 3);
              *(byte *)puVar80 = 0x2d;
              pcVar61 = (char *)-(long)pcVar59;
              if (uVar70 == 0) {
                pcVar61 = pcVar59;
              }
              pbVar81 = (byte *)((ulong)uVar70 + (long)puVar80);
              if (pcVar61 < (char *)0x5f5e100) {
                if (pcVar61 < (char *)0x64) {
                  *(undefined2 *)pbVar81 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar61 < (char *)0xa) + (long)pcVar61 * 2);
                  puVar80 = (uint *)(pbVar81 + (2 - (ulong)(pcVar61 < (char *)0xa)));
                }
                else {
                  iVar71 = (int)pcVar61;
                  if (pcVar61 < (char *)0x2710) {
                    uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                    uVar64 = (ulong)(pcVar61 < (char *)0x3e8);
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)(digit_table + uVar64 + (ulong)uVar70 * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                    puVar80 = (uint *)(pbVar81 + (4 - uVar64));
                  }
                  else if (pcVar61 < (char *)0xf4240) {
                    iVar71 = (int)((ulong)((long)pcVar61 * 0x68db9) >> 0x20) * -10000 + iVar71;
                    uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                    uVar64 = (ulong)(pcVar61 < (char *)0x186a0);
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)
                          (digit_table + uVar64 + ((ulong)((long)pcVar61 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                         *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                    *(undefined2 *)(pbVar81 + (4 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                    puVar80 = (uint *)(pbVar81 + (6 - uVar64));
                  }
                  else {
                    uVar70 = (uint)((ulong)((long)pcVar61 * 0x68db8bb) >> 0x20);
                    uVar83 = uVar70 >> 8;
                    iVar71 = uVar83 * -10000 + iVar71;
                    uVar83 = uVar83 * 0x147b >> 0x13;
                    uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                    uVar64 = (ulong)(pcVar61 < "cSt11char_traitsIcESaIcEEEDpT_");
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)(digit_table + uVar64 + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                    *(undefined2 *)(pbVar81 + (4 - uVar64)) =
                         *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                    *(undefined2 *)(pbVar81 + (6 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                    puVar80 = (uint *)(pbVar81 + (8 - uVar64));
                  }
                }
              }
              else {
                uVar64 = (ulong)pcVar61 / 100000000;
                pcVar59 = pcVar61 + uVar64 * 0xfa0a1f00;
                iVar71 = (int)uVar64;
                if (pcVar61 < (char *)0x2386f26fc10000) {
                  if (pcVar61 < (char *)0x2540be400) {
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar61 < (char *)0x3b9aca00) + uVar64 * 2);
                    pbVar81 = pbVar81 + (2 - (ulong)(pcVar61 < (char *)0x3b9aca00));
                  }
                  else if (pcVar61 < (char *)0xe8d4a51000) {
                    uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                    uVar64 = (ulong)(pcVar61 < (char *)0x174876e800);
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)(digit_table + uVar64 + (ulong)uVar70 * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                    pbVar81 = pbVar81 + (4 - uVar64);
                  }
                  else if (pcVar61 < (char *)0x5af3107a4000) {
                    iVar71 = (int)(uVar64 * 0x68db9 >> 0x20) * -10000 + iVar71;
                    uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                    uVar108 = (ulong)((ulong)pcVar61 >> 0xd < 0x48c27395);
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)(digit_table + uVar108 + (uVar64 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar108)) =
                         *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                    *(undefined2 *)(pbVar81 + (4 - uVar108)) =
                         *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                    pbVar81 = pbVar81 + (6 - uVar108);
                  }
                  else {
                    uVar70 = (uint)(uVar64 * 0x68db8bb >> 0x20);
                    uVar83 = uVar70 >> 8;
                    iVar71 = uVar83 * -10000 + iVar71;
                    uVar83 = uVar83 * 0x147b >> 0x13;
                    uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                    uVar64 = (ulong)(pcVar61 < (char *)0x38d7ea4c68000);
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)(digit_table + uVar64 + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                    *(undefined2 *)(pbVar81 + (4 - uVar64)) =
                         *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                    *(undefined2 *)(pbVar81 + (6 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                    pbVar81 = pbVar81 + (8 - uVar64);
                  }
                  uVar70 = (uint)(((ulong)pcVar59 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar83 = uVar70 >> 8;
                  iVar71 = uVar83 * -10000 + (int)pcVar59;
                  uVar83 = uVar83 * 0x147b >> 0x13;
                  uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                  *(undefined2 *)(pbVar81 + 2) =
                       *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                  *(undefined2 *)(pbVar81 + 4) = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                  *(undefined2 *)(pbVar81 + 6) =
                       *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2);
                  puVar80 = (uint *)(pbVar81 + 8);
                }
                else {
                  uVar64 = (ulong)pcVar61 / 1000000000000;
                  iVar60 = (int)uVar64;
                  if (pcVar61 < (char *)0xde0b6b3a7640000) {
                    iVar91 = (int)(uVar64 * 0x68db9 >> 0x20) * -10000 + iVar60;
                    uVar70 = (uint)(iVar91 * 0x147b) >> 0x13;
                    uVar108 = (ulong)(pcVar61 < (char *)0x16345785d8a0000);
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)(digit_table + uVar108 + (uVar64 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar108)) =
                         *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                    *(undefined2 *)(pbVar81 + (4 - uVar108)) =
                         *(undefined2 *)(digit_table + (uVar70 * -100 + iVar91) * 2);
                    lVar82 = 6 - uVar108;
                  }
                  else {
                    uVar70 = (uint)(uVar64 / 10000);
                    iVar91 = uVar70 * -10000 + iVar60;
                    uVar70 = uVar70 / 100;
                    uVar83 = (uint)(iVar91 * 0x147b) >> 0x13;
                    uVar108 = (ulong)(pcVar61 < (char *)0x8ac7230489e80000);
                    *(undefined2 *)pbVar81 =
                         *(undefined2 *)(digit_table + uVar108 + (ulong)uVar70 * 2);
                    *(undefined2 *)(pbVar81 + (2 - uVar108)) =
                         *(undefined2 *)(digit_table + (uVar70 * -100 + (int)(uVar64 / 10000)) * 2);
                    *(undefined2 *)(pbVar81 + (4 - uVar108)) =
                         *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar81 + (6 - uVar108)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + iVar91) * 2);
                    lVar82 = 8 - uVar108;
                  }
                  pbVar81 = pbVar81 + lVar82;
                  iVar71 = iVar71 + iVar60 * -10000;
                  uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                  *(undefined2 *)(pbVar81 + 2) =
                       *(undefined2 *)(digit_table + (uVar70 * 0x7fffff9c + iVar71) * 2);
                  uVar70 = (uint)(((ulong)pcVar59 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar83 = uVar70 >> 8;
                  iVar71 = uVar83 * -10000 + (int)pcVar59;
                  uVar83 = uVar83 * 0x147b >> 0x13;
                  uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                  *(undefined2 *)(pbVar81 + 4) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                  *(undefined2 *)(pbVar81 + 6) =
                       *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                  *(undefined2 *)(pbVar81 + 8) = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                  *(undefined2 *)(pbVar81 + 10) =
                       *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2);
                  puVar80 = (uint *)(pbVar81 + 0xc);
                }
              }
            }
            else {
              uVar64 = (ulong)pcVar59 & 0xfffffffffffff;
              uVar70 = uVar70 >> 0x14 & 0x7ff;
              if (uVar70 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) goto LAB_018af864;
                  if (uVar64 == 0) {
                    *(byte *)puVar80 = 0x2d;
                    puVar105 = (undefined8 *)((long)puVar80 - ((long)pcVar59 >> 0x3f));
                    *puVar105 = 0x7974696e69666e49;
                    puVar80 = (uint *)(puVar105 + 1);
                  }
                  else {
                    *puVar80 = 0x4e614e;
                    puVar80 = (uint *)((long)puVar80 + 3);
                  }
                }
                else {
                  *puVar80 = 0x6c6c756e;
                  puVar80 = puVar80 + 1;
                }
              }
              else {
                *(byte *)puVar80 = 0x2d;
                lVar82 = -((long)pcVar59 >> 0x3f);
                puVar105 = (undefined8 *)((long)puVar80 + lVar82);
                if (((ulong)pcVar59 & 0x7fffffffffffffff) == 0) {
                  *(undefined4 *)puVar105 = 0x302e30;
                  puVar80 = (uint *)((long)puVar105 + 3);
                }
                else if (uVar70 == 0) {
                  yyjson_mut_write_opts_impl();
                  puVar80 = local_40;
                }
                else {
                  uVar108 = uVar64 + 0x10000000000000;
                  if (uVar70 - 0x3ff < 0x35) {
                    lVar85 = 0;
                    if (uVar108 != 0) {
                      for (; (uVar108 >> lVar85 & 1) == 0; lVar85 = lVar85 + 1) {
                      }
                    }
                    if ((uint)lVar85 < 0x433 - uVar70) goto LAB_018ace51;
                    pcVar59 = (char *)(uVar108 >> ((byte)(0x433 - uVar70) & 0x3f));
                    if (pcVar59 < (char *)0x5f5e100) {
                      if (pcVar59 < (char *)0x64) {
                        *(undefined2 *)puVar105 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar59 < (char *)0xa) + (long)pcVar59 * 2);
                        pcVar59 = (char *)((long)puVar105 + (2 - (ulong)(pcVar59 < (char *)0xa)));
                      }
                      else {
                        iVar71 = (int)pcVar59;
                        if (pcVar59 < (char *)0x2710) {
                          uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                          uVar64 = (ulong)(pcVar59 < (char *)0x3e8);
                          *(undefined2 *)puVar105 =
                               *(undefined2 *)(digit_table + uVar64 + (ulong)uVar70 * 2);
                          *(undefined2 *)((long)puVar105 + (2 - uVar64)) =
                               *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                          pcVar59 = (char *)((long)puVar105 + (4 - uVar64));
                        }
                        else if (pcVar59 < (char *)0xf4240) {
                          iVar71 = (int)((ulong)((long)pcVar59 * 0x68db9) >> 0x20) * -10000 + iVar71
                          ;
                          uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                          uVar64 = (ulong)(pcVar59 < (char *)0x186a0);
                          *(undefined2 *)puVar105 =
                               *(undefined2 *)
                                (digit_table +
                                uVar64 + ((ulong)((long)pcVar59 * 0x68db9) >> 0x20) * 2);
                          *(undefined2 *)((long)puVar105 + (2 - uVar64)) =
                               *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                          *(undefined2 *)((long)puVar105 + (4 - uVar64)) =
                               *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                          pcVar59 = (char *)((long)puVar105 + (6 - uVar64));
                        }
                        else {
                          uVar70 = (uint)((ulong)((long)pcVar59 * 0x68db8bb) >> 0x20);
                          uVar83 = uVar70 >> 8;
                          iVar71 = uVar83 * -10000 + iVar71;
                          uVar83 = uVar83 * 0x147b >> 0x13;
                          uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                          uVar64 = (ulong)(pcVar59 < "cSt11char_traitsIcESaIcEEEDpT_");
                          *(undefined2 *)puVar105 =
                               *(undefined2 *)(digit_table + uVar64 + (ulong)uVar83 * 2);
                          *(undefined2 *)((long)puVar105 + (2 - uVar64)) =
                               *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                          *(undefined2 *)((long)puVar105 + (4 - uVar64)) =
                               *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                          *(undefined2 *)((long)puVar105 + (6 - uVar64)) =
                               *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                          pcVar59 = (char *)((long)puVar105 + (8 - uVar64));
                        }
                      }
                    }
                    else {
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ = pcVar59;
                      uVar64 = SUB168(auVar22 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                      if (pcVar59 < (char *)0x2540be400) {
                        *(undefined2 *)puVar105 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar59 < (char *)0x3b9aca00) + uVar64 * 2);
                        puVar90 = (undefined2 *)
                                  ((long)puVar105 + (2 - (ulong)(pcVar59 < (char *)0x3b9aca00)));
                      }
                      else {
                        iVar71 = (int)uVar64;
                        if (pcVar59 < (char *)0xe8d4a51000) {
                          uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                          uVar108 = (ulong)(pcVar59 < (char *)0x174876e800);
                          *(undefined2 *)puVar105 =
                               *(undefined2 *)(digit_table + uVar108 + (ulong)uVar70 * 2);
                          *(undefined2 *)((long)puVar105 + (2 - uVar108)) =
                               *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                          puVar90 = (undefined2 *)((long)puVar105 + (4 - uVar108));
                        }
                        else if (pcVar59 < (char *)0x5af3107a4000) {
                          iVar71 = (int)(uVar64 * 0x68db9 >> 0x20) * -10000 + iVar71;
                          uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                          uVar108 = (ulong)((ulong)pcVar59 >> 0xd < 0x48c27395);
                          *(undefined2 *)puVar105 =
                               *(undefined2 *)
                                (digit_table + uVar108 + (uVar64 * 0x68db9 >> 0x20) * 2);
                          *(undefined2 *)((long)puVar105 + (2 - uVar108)) =
                               *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                          *(undefined2 *)((long)puVar105 + (4 - uVar108)) =
                               *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                          puVar90 = (undefined2 *)((long)puVar105 + (6 - uVar108));
                        }
                        else {
                          uVar70 = (uint)(uVar64 * 0x68db8bb >> 0x20);
                          uVar83 = uVar70 >> 8;
                          iVar71 = uVar83 * -10000 + iVar71;
                          uVar83 = uVar83 * 0x147b >> 0x13;
                          uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                          uVar108 = (ulong)(pcVar59 < (char *)0x38d7ea4c68000);
                          *(undefined2 *)puVar105 =
                               *(undefined2 *)(digit_table + uVar108 + (ulong)uVar83 * 2);
                          *(undefined2 *)((long)puVar105 + (2 - uVar108)) =
                               *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                          *(undefined2 *)((long)puVar105 + (4 - uVar108)) =
                               *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                          *(undefined2 *)((long)puVar105 + (6 - uVar108)) =
                               *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                          puVar90 = (undefined2 *)((long)puVar105 + (8 - uVar108));
                        }
                      }
                      uVar70 = (uint)(((ulong)(pcVar59 + uVar64 * 0xfa0a1f00) & 0xffffffff) *
                                      0x68db8bb >> 0x20);
                      uVar83 = uVar70 >> 8;
                      iVar71 = uVar83 * -10000 + (int)(pcVar59 + uVar64 * 0xfa0a1f00);
                      uVar83 = uVar83 * 0x147b >> 0x13;
                      uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                      *puVar90 = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                      puVar90[1] = *(undefined2 *)
                                    (digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                      puVar90[2] = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                      puVar90[3] = *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2)
                      ;
                      pcVar59 = (char *)(puVar90 + 4);
                    }
                    pcVar59[0] = '.';
                    pcVar59[1] = '0';
LAB_018ae95e:
                    puVar80 = (uint *)(pcVar59 + 2);
                  }
                  else {
LAB_018ace51:
                    uVar101 = (ulong)((uint)pcVar59 & 1);
                    iVar71 = uVar70 * 0x4d105 + -0x200a5;
                    if (uVar70 == 1 || uVar64 != 0) {
                      iVar71 = uVar70 * 0x4d105;
                    }
                    iVar71 = iVar71 + -0x1439b7ff >> 0x14;
                    uVar79 = *(ulong *)(pow10_sig_table + (ulong)(iVar71 * -2 + 0x2ae) * 8);
                    uVar94 = *(long *)(pow10_sig_table + (ulong)(iVar71 * -2 + 0x2af) * 8) +
                             (ulong)(iVar71 - 1U < 0xffffffc8);
                    bVar78 = ((char)((uint)(iVar71 * -0x3526b) >> 0x10) + (char)uVar70) - 0x32;
                    uVar64 = (ulong)(uVar70 != 1 && uVar64 == 0) + uVar108 * 4 + -2 <<
                             (bVar78 & 0x3f);
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = uVar94;
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = uVar64;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = SUB168(auVar16 * auVar36,8);
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = uVar79;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = uVar64;
                    auVar51 = auVar17 * auVar37 + auVar51;
                    uVar64 = uVar108 * 4 << (bVar78 & 0x3f);
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = uVar94;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar64;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = SUB168(auVar18 * auVar38,8);
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = uVar79;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar64;
                    auVar52 = auVar19 * auVar39 + auVar52;
                    uVar86 = auVar52._8_8_;
                    uVar64 = uVar108 * 4 + 2 << (bVar78 & 0x3f);
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = uVar94;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = uVar64;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = SUB168(auVar20 * auVar40,8);
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = uVar79;
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = uVar64;
                    auVar53 = auVar21 * auVar41 + auVar53;
                    uVar64 = ((ulong)((auVar51 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar51._8_8_) + uVar101;
                    uVar101 = ((ulong)((auVar53 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar53._8_8_) - uVar101;
                    if (uVar86 < 0x28) {
LAB_018acfaf:
                      uVar79 = (auVar52 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0 | uVar86;
                      uVar108 = uVar86 & 0xfffffffffffffffc;
                      bVar111 = true;
                      if (uVar79 <= uVar108 + 2) {
                        bVar111 = (bool)((byte)((uVar86 & 0xffffffff) >> 2) & 0x3f &
                                        uVar79 == uVar108 + 2);
                      }
                      bVar110 = uVar108 + 4 <= uVar101;
                      if (uVar108 < uVar64 == bVar110) {
                        bVar111 = bVar110;
                      }
                      uVar64 = (ulong)bVar111 + (uVar86 >> 2);
                    }
                    else {
                      uVar79 = uVar86 / 0x28;
                      uVar108 = uVar79 * 0x28 + 0x28;
                      if (uVar79 * 0x28 < uVar64 != uVar108 <= uVar101) goto LAB_018acfaf;
                      uVar64 = (uVar79 + 1) - (ulong)(uVar101 < uVar108);
                      iVar71 = iVar71 + 1;
                    }
                    iVar60 = (0x11 - (uint)(uVar64 < 10000000000000000)) -
                             (uint)(uVar64 < 1000000000000000);
                    uVar70 = iVar60 + iVar71;
                    if (iVar60 + iVar71 + 5U < 0x1b) {
                      if ((int)uVar70 < 1) {
                        uVar108 = uVar64 / 100000000;
                        uVar83 = (uint)uVar108;
                        puVar90 = (undefined2 *)
                                  ((long)puVar105 +
                                  (((ulong)(2 - uVar70) + 1) - (ulong)(uVar83 < 100000000)));
                        iVar91 = (int)((uVar108 & 0xffffffff) / 10000);
                        iVar60 = iVar91 * -10000 + uVar83;
                        uVar64 = uVar108 * 0xfa0a1f00 + uVar64;
                        iVar71 = (int)(((uVar108 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar71 * 0x29) >> 0xc;
                        uVar93 = uVar96 * -100 + iVar71;
                        uVar88 = iVar71 * -100 + iVar91;
                        *(char *)((long)puVar105 + (ulong)(2 - uVar70)) = (char)uVar96 + '0';
                        uVar108 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
                        *puVar90 = *(undefined2 *)(digit_table + uVar108 + uVar93 * 2);
                        *(undefined2 *)((long)puVar90 + (2 - uVar108)) =
                             *(undefined2 *)(digit_table + uVar88 * 2);
                        iVar71 = (int)uVar64;
                        if (iVar71 == 0) {
                          if (iVar60 == 0) {
                            uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar93];
                            if (uVar88 != 0) {
                              uVar64 = 0;
                            }
                            uVar64 = uVar64 + (byte)dec_trailing_zero_table[uVar88];
                            lVar82 = 4;
                          }
                          else {
                            uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                            uVar88 = uVar83 * -100 + iVar60;
                            *(undefined2 *)((long)puVar90 + (4 - uVar108)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                            *(undefined2 *)((long)puVar90 + (6 - uVar108)) =
                                 *(undefined2 *)(digit_table + uVar88 * 2);
                            uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar83] + 2;
                            if (uVar88 != 0) {
                              uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar88];
                            }
                            lVar82 = 8;
                          }
                          uVar64 = lVar82 - uVar64;
                        }
                        else {
                          uVar93 = (uint)(iVar60 * 0x147b) >> 0x13;
                          uVar83 = (uint)((uVar64 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar83 >> 8;
                          uVar88 = uVar96 * 0x147b >> 0x13;
                          uVar64 = (ulong)uVar88;
                          uVar83 = uVar88 * -100 + (uVar83 >> 8);
                          *(undefined2 *)((long)puVar90 + (4 - uVar108)) =
                               *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                          *(undefined2 *)((long)puVar90 + (6 - uVar108)) =
                               *(undefined2 *)(digit_table + (uVar93 * 0x7fffff9c + iVar60) * 2);
                          *(undefined2 *)((long)puVar90 + (8 - uVar108)) =
                               *(undefined2 *)(digit_table + uVar64 * 2);
                          *(undefined2 *)((long)puVar90 + (10 - uVar108)) =
                               *(undefined2 *)(digit_table + uVar83 * 2);
                          iVar71 = uVar96 * -10000 + iVar71;
                          if (iVar71 == 0) {
                            lVar82 = 0xc;
                          }
                          else {
                            uVar83 = (uint)(iVar71 * 0x147b) >> 0x13;
                            uVar64 = (ulong)uVar83;
                            uVar83 = uVar83 * -100 + iVar71;
                            *(undefined2 *)((long)puVar90 + (0xc - uVar108)) =
                                 *(undefined2 *)(digit_table + uVar64 * 2);
                            *(undefined2 *)((long)puVar90 + (0xe - uVar108)) =
                                 *(undefined2 *)(digit_table + uVar83 * 2);
                            lVar82 = 0x10;
                          }
                          uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar64] + 2;
                          if (uVar83 != 0) {
                            uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                          }
                          uVar64 = lVar82 - uVar64;
                        }
                        puVar80 = (uint *)((long)puVar90 + ((uVar64 & 0xffffffff) - uVar108));
                        *(undefined2 *)puVar105 = 0x2e30;
                        if ((int)uVar70 < 0) {
                          switchD_012e5a64::default
                                    ((undefined2 *)((long)puVar105 + 2),0x30,(ulong)-uVar70);
                        }
                      }
                      else {
                        uVar108 = uVar64 / 100000000;
                        uVar83 = (uint)uVar108;
                        puVar90 = (undefined2 *)((long)puVar105 + (2 - (ulong)(uVar83 < 100000000)))
                        ;
                        iVar91 = (int)((uVar108 & 0xffffffff) / 10000);
                        iVar60 = iVar91 * -10000 + uVar83;
                        uVar64 = uVar108 * 0xfa0a1f00 + uVar64;
                        iVar71 = (int)(((uVar108 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar71 * 0x29) >> 0xc;
                        uVar93 = uVar96 * -100 + iVar71;
                        uVar88 = iVar71 * -100 + iVar91;
                        *puVar105 = 0x3030303030303030;
                        puVar105[1] = 0x3030303030303030;
                        puVar105[2] = 0x3030303030303030;
                        *(char *)((long)puVar105 + 1) = (char)uVar96 + '0';
                        uVar108 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
                        *puVar90 = *(undefined2 *)(digit_table + uVar108 + uVar93 * 2);
                        *(undefined2 *)((long)puVar90 + (2 - uVar108)) =
                             *(undefined2 *)(digit_table + uVar88 * 2);
                        iVar71 = (int)uVar64;
                        if (iVar71 == 0) {
                          if (iVar60 == 0) {
                            uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar93];
                            if (uVar88 != 0) {
                              uVar64 = 0;
                            }
                            uVar64 = uVar64 + (byte)dec_trailing_zero_table[uVar88];
                            lVar85 = 4;
                          }
                          else {
                            uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                            uVar88 = uVar83 * -100 + iVar60;
                            *(undefined2 *)((long)puVar90 + (4 - uVar108)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                            *(undefined2 *)((long)puVar90 + (6 - uVar108)) =
                                 *(undefined2 *)(digit_table + uVar88 * 2);
                            uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar83] + 2;
                            if (uVar88 != 0) {
                              uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar88];
                            }
                            lVar85 = 8;
                          }
                          uVar64 = lVar85 - uVar64;
                        }
                        else {
                          uVar93 = (uint)(iVar60 * 0x147b) >> 0x13;
                          uVar83 = (uint)((uVar64 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar83 >> 8;
                          uVar88 = uVar96 * 0x147b >> 0x13;
                          uVar64 = (ulong)uVar88;
                          uVar83 = uVar88 * -100 + (uVar83 >> 8);
                          *(undefined2 *)((long)puVar90 + (4 - uVar108)) =
                               *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                          *(undefined2 *)((long)puVar90 + (6 - uVar108)) =
                               *(undefined2 *)(digit_table + (uVar93 * 0x7fffff9c + iVar60) * 2);
                          *(undefined2 *)((long)puVar90 + (8 - uVar108)) =
                               *(undefined2 *)(digit_table + uVar64 * 2);
                          *(undefined2 *)((long)puVar90 + (10 - uVar108)) =
                               *(undefined2 *)(digit_table + uVar83 * 2);
                          iVar71 = uVar96 * -10000 + iVar71;
                          if (iVar71 == 0) {
                            lVar85 = 0xc;
                          }
                          else {
                            uVar83 = (uint)(iVar71 * 0x147b) >> 0x13;
                            uVar64 = (ulong)uVar83;
                            uVar83 = uVar83 * -100 + iVar71;
                            *(undefined2 *)((long)puVar90 + (0xc - uVar108)) =
                                 *(undefined2 *)(digit_table + uVar64 * 2);
                            *(undefined2 *)((long)puVar90 + (0xe - uVar108)) =
                                 *(undefined2 *)(digit_table + uVar83 * 2);
                            lVar85 = 0x10;
                          }
                          uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar64] + 2;
                          if (uVar83 != 0) {
                            uVar64 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                          }
                          uVar64 = lVar85 - uVar64;
                        }
                        puVar103 = (uint *)((long)puVar90 + ((uVar64 & 0xffffffff) - uVar108));
                        uVar64 = 0;
                        do {
                          *(byte *)((long)puVar80 + uVar64 + lVar82) =
                               *(byte *)((long)puVar80 + uVar64 + lVar82 + 1);
                          uVar64 = uVar64 + 1;
                        } while (uVar70 != uVar64);
                        puVar65 = (undefined1 *)((ulong)uVar70 + (long)puVar105);
                        puVar80 = (uint *)(puVar65 + 2);
                        *puVar65 = 0x2e;
                        if (puVar80 < puVar103) {
                          puVar80 = puVar103;
                        }
                      }
                    }
                    else {
                      uVar108 = uVar64 / 100000000;
                      uVar83 = (uint)uVar108;
                      lVar82 = 2 - (ulong)(uVar83 < 100000000);
                      iVar91 = (int)((uVar108 & 0xffffffff) / 10000);
                      iVar60 = iVar91 * -10000 + uVar83;
                      uVar64 = uVar108 * 0xfa0a1f00 + uVar64;
                      iVar71 = (int)(((uVar108 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar96 = (uint)(iVar71 * 0x29) >> 0xc;
                      uVar93 = uVar96 * -100 + iVar71;
                      uVar88 = iVar71 * -100 + iVar91;
                      *(char *)((long)puVar105 + 1) = (char)uVar96 + '0';
                      uVar108 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
                      *(undefined2 *)((long)puVar105 + lVar82) =
                           *(undefined2 *)(digit_table + uVar108 + uVar93 * 2);
                      lVar82 = lVar82 - uVar108;
                      *(undefined2 *)((long)puVar105 + lVar82 + 2) =
                           *(undefined2 *)(digit_table + uVar88 * 2);
                      iVar71 = (int)uVar64;
                      if (iVar71 == 0) {
                        if (iVar60 == 0) {
                          uVar83 = (uint)(byte)dec_trailing_zero_table[uVar93];
                          if (uVar88 != 0) {
                            uVar83 = 0;
                          }
                          uVar83 = uVar83 + (byte)dec_trailing_zero_table[uVar88];
                          iVar71 = 4;
                        }
                        else {
                          uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                          uVar88 = uVar83 * -100 + iVar60;
                          *(undefined2 *)((long)puVar105 + lVar82 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                          *(undefined2 *)((long)puVar105 + lVar82 + 6) =
                               *(undefined2 *)(digit_table + uVar88 * 2);
                          uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
                          if (uVar88 != 0) {
                            uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                          }
                          iVar71 = 8;
                        }
                        uVar83 = iVar71 - uVar83;
                      }
                      else {
                        uVar96 = (uint)(iVar60 * 0x147b) >> 0x13;
                        uVar83 = (uint)((uVar64 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar97 = uVar83 >> 8;
                        uVar93 = uVar97 * 0x147b >> 0x13;
                        uVar88 = uVar93 * -100 + (uVar83 >> 8);
                        *(undefined2 *)((long)puVar105 + lVar82 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar96 * 2);
                        *(undefined2 *)((long)puVar105 + lVar82 + 6) =
                             *(undefined2 *)(digit_table + (uVar96 * 0x7fffff9c + iVar60) * 2);
                        *(undefined2 *)((long)puVar105 + lVar82 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                        *(undefined2 *)((long)puVar105 + lVar82 + 10) =
                             *(undefined2 *)(digit_table + uVar88 * 2);
                        iVar71 = uVar97 * -10000 + iVar71;
                        if (iVar71 == 0) {
                          uVar83 = (byte)dec_trailing_zero_table[uVar93] + 2;
                          if (uVar88 != 0) {
                            uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                          }
                          iVar71 = 0xc;
                        }
                        else {
                          uVar83 = (uint)(iVar71 * 0x147b) >> 0x13;
                          uVar88 = uVar83 * -100 + iVar71;
                          *(undefined2 *)((long)puVar105 + lVar82 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                          *(undefined2 *)((long)puVar105 + lVar82 + 0xe) =
                               *(undefined2 *)(digit_table + uVar88 * 2);
                          uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
                          if (uVar88 != 0) {
                            uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                          }
                          iVar71 = 0x10;
                        }
                        uVar83 = iVar71 - uVar83;
                      }
                      puVar90 = (undefined2 *)
                                ((long)puVar105 +
                                (((ulong)uVar83 + lVar82) - (ulong)((ulong)uVar83 + lVar82 == 2)));
                      uVar70 = uVar70 - 1;
                      *(undefined1 *)puVar105 = *(undefined1 *)((long)puVar105 + 1);
                      *(undefined1 *)((long)puVar105 + 1) = 0x2e;
                      *puVar90 = 0x2d65;
                      uVar88 = uVar70 >> 0x1f;
                      pcVar59 = (char *)((long)puVar90 + (ulong)uVar88 + 1);
                      uVar83 = -uVar70;
                      if (0 < (int)uVar70) {
                        uVar83 = uVar70;
                      }
                      if (uVar83 < 100) {
                        *(undefined2 *)pcVar59 =
                             *(undefined2 *)(digit_table + (ulong)(uVar83 < 10) + (ulong)uVar83 * 2)
                        ;
                        pcVar59 = pcVar59 + -(ulong)(uVar83 < 10);
                        goto LAB_018ae95e;
                      }
                      *pcVar59 = (char)(uVar83 * 0x290 >> 0x10) + '0';
                      *(undefined2 *)((long)puVar90 + (ulong)uVar88 + 2) =
                           *(undefined2 *)
                            (digit_table + ((uVar83 * 0x290 >> 0x10) * 0x7fffff9c + uVar83) * 2);
                      puVar80 = (uint *)((long)puVar90 + (ulong)uVar88 + 4);
                    }
                  }
                }
              }
            }
            *(byte *)puVar80 = 0x2c;
            puVar80 = (uint *)((long)puVar80 + 1);
          }
          else if (((uint)uVar64 & 7) == 5) {
            uVar108 = uVar64 >> 8;
            puVar103 = (uint *)(pyVar76->uni).str;
            puVar75 = puVar62;
            if (puVar62 <= (uint *)((long)puVar80 + uVar108 * 6 + 0x10)) {
              uVar101 = uVar108 * 6 + 0x10;
              uVar79 = local_e0 >> 1;
              if (local_e0 >> 1 <= uVar101) {
                uVar79 = uVar101;
              }
              sVar77 = (uVar79 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar77);
              if (pbVar81 == (byte *)0x0) goto LAB_018af7e8;
              puVar75 = (uint *)(pbVar81 + (sVar77 - ((long)local_d0 - (long)puVar62)));
              memmove(puVar75,pbVar81 + ((long)puVar62 - (long)local_f8),
                      (long)local_d0 - (long)puVar62);
              puVar80 = (uint *)(pbVar81 + ((long)puVar80 - (long)local_f8));
              local_d0 = (uint *)(pbVar81 + sVar77);
              local_f8 = pbVar81;
              local_e0 = sVar77;
            }
            if (puVar100 != enc_table_cpy) {
              puVar62 = (uint *)(uVar108 + (long)puVar103);
              *(byte *)puVar80 = 0x22;
LAB_018aeaef:
              lVar82 = (long)puVar62 - (long)puVar103;
              if (0xf < lVar82) {
                lVar85 = 0;
                do {
                  puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                  puVar57 = (uint *)(lVar85 + (long)puVar103);
                  bVar78 = *(byte *)((long)puVar103 + lVar85);
                  if (puVar100[bVar78] != '\0') goto LAB_018aed29;
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 1)] != '\0') {
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                    puVar57 = (uint *)((long)puVar103 + lVar85);
                    goto LAB_018aeccb;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 2)] != '\0') {
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                    puVar57 = (uint *)((long)puVar103 + lVar85);
                    goto LAB_018aece0;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 3)] != '\0') {
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                    puVar57 = (uint *)((long)puVar103 + lVar85);
                    goto LAB_018aecfb;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 4)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar85 + (long)puVar103) + 4);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 5);
                    *(undefined4 *)((long)puVar80 + lVar85 + 1) =
                         *(undefined4 *)(lVar85 + (long)puVar103);
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 5)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 5);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 6);
                    *(byte *)((long)puVar104 + -1) = pbVar81[4];
                    *(undefined4 *)((long)puVar104 + -5) = *(undefined4 *)pbVar81;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 6)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 6);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 7);
                    *(ushort *)((long)puVar104 + -2) = *(ushort *)(pbVar81 + 4);
                    *(undefined4 *)((long)puVar104 + -6) = *(undefined4 *)pbVar81;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 7)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 7);
                    uVar3 = *(undefined4 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 8);
                    *(undefined4 *)((long)puVar80 + lVar85 + 4) = *(undefined4 *)(pbVar81 + 3);
                    *(undefined4 *)((long)puVar80 + lVar85 + 1) = uVar3;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 8)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar85 + (long)puVar103) + 8);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 9);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) =
                         *(undefined8 *)(lVar85 + (long)puVar103);
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 9)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 9);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 10);
                    *(byte *)((long)puVar104 + -1) = pbVar81[8];
                    *(undefined8 *)((long)puVar104 + -9) = *(undefined8 *)pbVar81;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 10)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 10);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xb);
                    *(ushort *)((long)puVar104 + -2) = *(ushort *)(pbVar81 + 8);
                    *(undefined8 *)((long)puVar104 + -10) = *(undefined8 *)pbVar81;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 0xb)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xb);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xc);
                    puVar104[-1] = *(uint *)(pbVar81 + 7);
                    *(undefined8 *)((long)puVar104 + -0xb) = *(undefined8 *)pbVar81;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 0xc)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xc);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xd);
                    puVar104[-1] = *(uint *)(pbVar81 + 8);
                    *(undefined8 *)(puVar104 + -3) = *(undefined8 *)pbVar81;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 0xd)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xd);
                    uVar73 = *(undefined8 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xe);
                    *(undefined8 *)((long)puVar80 + lVar85 + 6) = *(undefined8 *)(pbVar81 + 5);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) = uVar73;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 0xe)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xe);
                    uVar73 = *(undefined8 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xf);
                    *(undefined8 *)((long)puVar80 + lVar85 + 7) = *(undefined8 *)(pbVar81 + 6);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) = uVar73;
                    goto LAB_018aed29;
                  }
                  if (puVar100[*(byte *)((long)puVar103 + lVar85 + 0xf)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xf);
                    uVar73 = *(undefined8 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0x10);
                    *(undefined8 *)((long)puVar80 + lVar85 + 8) = *(undefined8 *)(pbVar81 + 7);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) = uVar73;
                    goto LAB_018aed29;
                  }
                  uVar73 = *(undefined8 *)(puVar57 + 2);
                  *(undefined8 *)puVar104 = *(undefined8 *)puVar57;
                  *(undefined8 *)((long)puVar80 + lVar85 + 9) = uVar73;
                  lVar85 = lVar85 + 0x10;
                  lVar82 = lVar82 + -0x10;
                } while (0xf < lVar82);
                puVar80 = (uint *)((long)puVar80 + lVar85);
                puVar103 = (uint *)((long)puVar103 + lVar85);
              }
              puVar104 = (uint *)((long)puVar80 + 1);
              puVar57 = puVar103;
              if (3 < lVar82) {
                lVar82 = (long)puVar62 - (long)puVar103;
                do {
                  bVar78 = (byte)*puVar57;
                  if (puVar100[bVar78] != '\0') goto LAB_018aed29;
                  if (puVar100[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_018aeccb;
                  if (puVar100[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_018aece0;
                  if (puVar100[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_018aecfb;
                  *puVar104 = *puVar57;
                  puVar104 = puVar104 + 1;
                  puVar57 = puVar57 + 1;
                  lVar82 = lVar82 + -4;
                } while (3 < lVar82);
              }
              if (puVar57 < puVar62) {
                while (uVar70 = *puVar57, puVar100[(byte)uVar70] == '\0') {
                  puVar57 = (uint *)((long)puVar57 + 1);
                  *(byte *)puVar104 = (byte)uVar70;
                  puVar104 = (uint *)((long)puVar104 + 1);
                  if (puVar62 <= puVar57) goto switchD_018ad24c_default;
                }
                goto LAB_018aed29;
              }
              goto switchD_018ad24c_default;
            }
            uVar58 = pyVar76->tag;
            *(byte *)puVar80 = 0x22;
            if ((uVar58 & 0x18) == 0) {
              puVar62 = (uint *)(uVar108 + (long)puVar103);
LAB_018ad009:
              lVar82 = (long)puVar62 - (long)puVar103;
              if (0xf < lVar82) {
                lVar85 = 0;
                do {
                  puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                  puVar57 = (uint *)(lVar85 + (long)puVar103);
                  bVar78 = *(byte *)((long)puVar103 + lVar85);
                  if (enc_table_cpy[bVar78] != '\0') goto LAB_018ad221;
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 1)] != '\0') {
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                    puVar57 = (uint *)((long)puVar103 + lVar85);
                    goto LAB_018ad1d6;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 2)] != '\0') {
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                    puVar57 = (uint *)((long)puVar103 + lVar85);
                    goto LAB_018ad1eb;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 3)] != '\0') {
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 1);
                    puVar57 = (uint *)((long)puVar103 + lVar85);
                    goto LAB_018ad206;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 4)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar85 + (long)puVar103) + 4);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 5);
                    *(undefined4 *)((long)puVar80 + lVar85 + 1) =
                         *(undefined4 *)(lVar85 + (long)puVar103);
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 5)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 5);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 6);
                    *(byte *)((long)puVar104 + -1) = pbVar81[4];
                    *(undefined4 *)((long)puVar104 + -5) = *(undefined4 *)pbVar81;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 6)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 6);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 7);
                    *(ushort *)((long)puVar104 + -2) = *(ushort *)(pbVar81 + 4);
                    *(undefined4 *)((long)puVar104 + -6) = *(undefined4 *)pbVar81;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 7)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 7);
                    uVar3 = *(undefined4 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 8);
                    *(undefined4 *)((long)puVar80 + lVar85 + 4) = *(undefined4 *)(pbVar81 + 3);
                    *(undefined4 *)((long)puVar80 + lVar85 + 1) = uVar3;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 8)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar85 + (long)puVar103) + 8);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 9);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) =
                         *(undefined8 *)(lVar85 + (long)puVar103);
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 9)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 9);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 10);
                    *(byte *)((long)puVar104 + -1) = pbVar81[8];
                    *(undefined8 *)((long)puVar104 + -9) = *(undefined8 *)pbVar81;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 10)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 10);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xb);
                    *(ushort *)((long)puVar104 + -2) = *(ushort *)(pbVar81 + 8);
                    *(undefined8 *)((long)puVar104 + -10) = *(undefined8 *)pbVar81;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 0xb)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xb);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xc);
                    puVar104[-1] = *(uint *)(pbVar81 + 7);
                    *(undefined8 *)((long)puVar104 + -0xb) = *(undefined8 *)pbVar81;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 0xc)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xc);
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xd);
                    puVar104[-1] = *(uint *)(pbVar81 + 8);
                    *(undefined8 *)(puVar104 + -3) = *(undefined8 *)pbVar81;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 0xd)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xd);
                    uVar73 = *(undefined8 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xe);
                    *(undefined8 *)((long)puVar80 + lVar85 + 6) = *(undefined8 *)(pbVar81 + 5);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) = uVar73;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 0xe)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xe);
                    uVar73 = *(undefined8 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0xf);
                    *(undefined8 *)((long)puVar80 + lVar85 + 7) = *(undefined8 *)(pbVar81 + 6);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) = uVar73;
                    goto LAB_018ad221;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar103 + lVar85 + 0xf)] != '\0') {
                    pbVar81 = (byte *)(lVar85 + (long)puVar103);
                    puVar57 = (uint *)(pbVar81 + 0xf);
                    uVar73 = *(undefined8 *)pbVar81;
                    puVar104 = (uint *)((long)puVar80 + lVar85 + 0x10);
                    *(undefined8 *)((long)puVar80 + lVar85 + 8) = *(undefined8 *)(pbVar81 + 7);
                    *(undefined8 *)((long)puVar80 + lVar85 + 1) = uVar73;
                    goto LAB_018ad221;
                  }
                  uVar73 = *(undefined8 *)(puVar57 + 2);
                  *(undefined8 *)puVar104 = *(undefined8 *)puVar57;
                  *(undefined8 *)((long)puVar80 + lVar85 + 9) = uVar73;
                  lVar85 = lVar85 + 0x10;
                  lVar82 = lVar82 + -0x10;
                } while (0xf < lVar82);
                puVar80 = (uint *)((long)puVar80 + lVar85);
                puVar103 = (uint *)((long)puVar103 + lVar85);
              }
              puVar104 = (uint *)((long)puVar80 + 1);
              puVar57 = puVar103;
              if (3 < lVar82) {
                lVar82 = (long)puVar62 - (long)puVar103;
                do {
                  bVar78 = (byte)*puVar57;
                  if (enc_table_cpy[bVar78] != '\0') goto LAB_018ad221;
                  if (enc_table_cpy[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_018ad1d6;
                  if (enc_table_cpy[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_018ad1eb;
                  if (enc_table_cpy[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_018ad206;
                  *puVar104 = *puVar57;
                  puVar104 = puVar104 + 1;
                  puVar57 = puVar57 + 1;
                  lVar82 = lVar82 + -4;
                } while (3 < lVar82);
              }
              if (puVar57 < puVar62) {
                while (uVar70 = *puVar57, enc_table_cpy[(byte)uVar70] == '\0') {
                  puVar57 = (uint *)((long)puVar57 + 1);
                  *(byte *)puVar104 = (byte)uVar70;
                  puVar104 = (uint *)((long)puVar104 + 1);
                  if (puVar62 <= puVar57) goto switchD_018ad24c_default;
                }
                goto LAB_018ad221;
              }
              goto switchD_018ad24c_default;
            }
            puVar104 = (uint *)((long)puVar80 + 1);
            if (0xfff < uVar64) {
              do {
                uVar73 = *(undefined8 *)(puVar103 + 2);
                *(undefined8 *)puVar104 = *(undefined8 *)puVar103;
                *(undefined8 *)(puVar104 + 2) = uVar73;
                puVar104 = puVar104 + 4;
                puVar103 = puVar103 + 4;
                uVar108 = uVar108 - 0x10;
              } while (0xf < uVar108);
            }
            for (; 3 < uVar108; uVar108 = uVar108 - 4) {
              *puVar104 = *puVar103;
              puVar104 = puVar104 + 1;
              puVar103 = puVar103 + 1;
            }
            if (uVar108 != 0) {
              uVar64 = 0;
              do {
                *(byte *)((long)puVar104 + uVar64) = *(byte *)((long)puVar103 + uVar64);
                uVar64 = uVar64 + 1;
              } while (uVar108 != uVar64);
              puVar104 = (uint *)((long)puVar104 + uVar64);
            }
switchD_018ad24c_default:
            local_e8 = (uint)uVar84;
            bVar78 = 0x3a;
            if ((~(uint)lVar98 & local_e8) == 0) {
              bVar78 = 0x2c;
            }
            *(byte *)puVar104 = 0x22;
            *(byte *)((long)puVar104 + 1) = bVar78;
            puVar80 = (uint *)((long)puVar104 + 2);
            puVar62 = puVar75;
          }
          else if ((~(byte)uVar64 & 6) == 0) {
            if (puVar62 <= puVar80 + 4) {
              uVar108 = local_e0 >> 1;
              if (uVar108 < 0x11) {
                uVar108 = 0x10;
              }
              sVar77 = (uVar108 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar77);
              if (pbVar81 == (byte *)0x0) goto LAB_018af7e8;
              sVar74 = (long)local_d0 - (long)puVar62;
              memmove(pbVar81 + (sVar77 - sVar74),pbVar81 + ((long)puVar62 - (long)local_f8),sVar74)
              ;
              puVar80 = (uint *)(pbVar81 + ((long)puVar80 - (long)local_f8));
              local_d0 = (uint *)(pbVar81 + sVar77);
              local_e0 = sVar77;
              puVar62 = (uint *)(pbVar81 + (sVar77 - sVar74));
              local_f8 = pbVar81;
            }
            if (0xff < uVar64) {
              lVar82 = (uVar64 >> 8) << (bVar78 == 7);
              puVar103 = puVar62 + -4;
              puVar75 = (uint *)((long)puVar80 + 1);
              *(ulong *)(puVar62 + -4) = uVar84 + lVar98 * 2;
              *(yyjson_mut_val **)(puVar62 + -2) = local_68;
              *(byte *)puVar80 = (bVar78 == 7) << 5 | 0x5b;
              local_50 = 0;
              pyVar66 = (yyjson_mut_val *)(pyVar76->uni).u64;
              lVar98 = lVar82;
              local_68 = pyVar76;
              if (bVar78 == 7) {
                pyVar66 = pyVar66->next;
                local_50 = 1;
              }
              goto LAB_018acba8;
            }
            bVar78 = (bVar78 == 7) * ' ';
            *(byte *)puVar80 = bVar78 + 0x5b;
            *(byte *)((long)puVar80 + 1) = bVar78 | 0x5d;
            *(byte *)((long)puVar80 + 2) = 0x2c;
            puVar80 = (uint *)((long)puVar80 + 3);
          }
          else if (bVar78 == 1) {
            uVar64 = uVar64 >> 8;
            pvVar8 = (pyVar76->uni).ptr;
            if (puVar62 <= (uint *)((long)puVar80 + uVar64 + 2)) {
              uVar108 = local_e0 >> 1;
              if (local_e0 >> 1 <= uVar64 + 2) {
                uVar108 = uVar64 + 2;
              }
              sVar77 = (uVar108 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar77);
              if (pbVar81 == (byte *)0x0) goto LAB_018af7e8;
              sVar74 = (long)local_d0 - (long)puVar62;
              memmove(pbVar81 + (sVar77 - sVar74),pbVar81 + ((long)puVar62 - (long)local_f8),sVar74)
              ;
              puVar80 = (uint *)(pbVar81 + ((long)puVar80 - (long)local_f8));
              local_d0 = (uint *)(pbVar81 + sVar77);
              puVar62 = (uint *)(pbVar81 + (sVar77 - sVar74));
              local_f8 = pbVar81;
              local_e0 = sVar77;
            }
            switchD_012bc561::default(puVar80,pvVar8,uVar64);
            pbVar81 = (byte *)((long)puVar80 + uVar64);
            puVar80 = (uint *)(pbVar81 + 1);
            *pbVar81 = 0x2c;
          }
          else if (bVar78 == 2) {
            puVar103 = puVar62;
            if (puVar62 <= puVar80 + 4) {
              uVar64 = local_e0 >> 1;
              if (uVar64 < 0x11) {
                uVar64 = 0x10;
              }
              sVar77 = (uVar64 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar77);
              if (pbVar81 == (byte *)0x0) goto LAB_018af7e8;
              puVar103 = (uint *)(pbVar81 + (sVar77 - ((long)local_d0 - (long)puVar62)));
              memmove(puVar103,pbVar81 + ((long)puVar62 - (long)local_f8),
                      (long)local_d0 - (long)puVar62);
              puVar80 = (uint *)(pbVar81 + ((long)puVar80 - (long)local_f8));
              local_d0 = (uint *)(pbVar81 + sVar77);
              local_f8 = pbVar81;
              local_e0 = sVar77;
            }
            puVar80[0] = 0x6c6c756e;
            puVar80[1] = 0xa2c;
            puVar80 = (uint *)((long)puVar80 + 5);
            puVar62 = puVar103;
          }
          else {
            if (bVar78 != 3) goto LAB_018af828;
            puVar103 = puVar62;
            if (puVar62 <= puVar80 + 4) {
              uVar64 = local_e0 >> 1;
              if (uVar64 < 0x11) {
                uVar64 = 0x10;
              }
              sVar77 = (uVar64 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar77);
              if (pbVar81 == (byte *)0x0) goto LAB_018af7e8;
              puVar103 = (uint *)(pbVar81 + (sVar77 - ((long)local_d0 - (long)puVar62)));
              memmove(puVar103,pbVar81 + ((long)puVar62 - (long)local_f8),
                      (long)local_d0 - (long)puVar62);
              puVar80 = (uint *)(pbVar81 + ((long)puVar80 - (long)local_f8));
              local_d0 = (uint *)(pbVar81 + sVar77);
              uVar64 = pyVar76->tag;
              local_f8 = pbVar81;
              local_e0 = sVar77;
            }
            bVar111 = (uVar64 & 0x18) != 0;
            uVar73 = 0xa2c65736c6166;
            if (bVar111) {
              uVar73 = 0xa2c65757274;
            }
            *(undefined8 *)puVar80 = uVar73;
            puVar80 = (uint *)((long)puVar80 + (6 - (ulong)bVar111));
            puVar62 = puVar103;
          }
          lVar98 = lVar98 + -1;
        } while (lVar98 != 0);
        pbVar81 = local_f8 + ~(ulong)puVar80;
        lVar82 = 0;
        pyVar76 = local_68;
        do {
          local_68 = pyVar76;
          *(byte *)((long)puVar80 + -1) = (char)local_50 * ' ' + 0x5d;
          puVar75 = (uint *)((long)puVar80 + 1);
          *(byte *)puVar80 = 0x2c;
          if (local_d0 <= (uint *)((long)puVar62 + lVar82)) {
            if (local_fc < '\0') {
              if ((uint *)((long)puVar62 + lVar82) <= (uint *)((long)puVar80 + 3)) {
                uVar84 = 2;
                if (2 < local_e0 >> 1) {
                  uVar84 = local_e0 >> 1;
                }
                uVar84 = uVar84 + 0xf & 0xfffffffffffffff0;
                pbVar109 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,uVar84 + local_e0);
                if (pbVar109 == (byte *)0x0) goto LAB_018af7e8;
                memmove(pbVar109 +
                        (long)((long)puVar62 + lVar82 + ((uVar84 + local_e0) - (long)local_d0)),
                        (byte *)((long)puVar62 + (lVar82 - (long)local_f8)) + (long)pbVar109,
                        (size_t)((long)local_d0 + (-lVar82 - (long)puVar62)));
                puVar75 = (uint *)(pbVar109 + -(long)pbVar81);
                local_f8 = pbVar109;
              }
              *(byte *)((long)puVar75 + -1) = 10;
              puVar80 = puVar75;
            }
            *(byte *)puVar80 = 0;
            if (dat_len != (usize *)0x0) {
              *dat_len = (long)puVar80 - (long)local_f8;
            }
            goto LAB_018b1f54;
          }
          puVar102 = (ulong *)((long)puVar62 + lVar82);
          pyVar76 = *(yyjson_mut_val **)((long)puVar62 + lVar82 + 8);
          local_50 = *puVar102 & 0xffffffffffffff01;
          lVar82 = lVar82 + 0x10;
          pbVar81 = pbVar81 + -1;
          lVar98 = (*puVar102 >> 1) - 1;
          puVar80 = puVar75;
        } while (lVar98 == 0);
        puVar103 = (uint *)((long)puVar62 + lVar82);
        pyVar66 = local_68;
        local_68 = pyVar76;
      } while( true );
    }
    if ((flg & 2) == 0) {
      local_d0 = (uint *)enc_table_cpy_slash;
      if ((flg & 4) == 0) {
        local_d0 = (uint *)enc_table_cpy;
      }
    }
    else {
      local_d0 = (uint *)enc_table_esc_slash;
      if ((flg & 4) == 0) {
        local_d0 = (uint *)enc_table_esc;
      }
    }
    uVar84 = estimated_val_num * 0x20 + 0x40;
    local_f8 = (byte *)(*p_Var4)(pvVar6,uVar84);
    if (local_f8 == (byte *)0x0) {
      local_f8 = (byte *)0x0;
LAB_018af790:
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar67 = &local_60;
      if (err != (yyjson_write_err *)0x0) {
        pyVar67 = err;
      }
      pyVar68->code = 2;
      pyVar67->msg = "memory allocation failed";
      if (local_f8 == (byte *)0x0) {
        return (char *)0x0;
      }
      (*p_Var5)(pvVar6,local_f8);
      return (char *)0x0;
    }
    uVar70 = (uint)val->tag & 7;
    bVar111 = uVar70 == 7;
    local_78 = (ulong)bVar111;
    lVar98 = (val->tag >> 8) << bVar111;
    *local_f8 = bVar111 << 5 | 0x5b;
    local_f8[1] = 10;
    uVar58 = (val->uni).u64;
    if (uVar70 == 7) {
      uVar58 = *(uint64_t *)(uVar58 + 0x10);
    }
    lVar82 = (ulong)((flg & 0x40) == 0) * 2 + 2;
    puVar102 = (ulong *)(local_f8 + (estimated_val_num * 8 + 0x10) * 4);
    puVar103 = (uint *)(local_f8 + 2);
    pyVar66 = *(yyjson_mut_val **)(uVar58 + 0x10);
    lVar85 = 1;
    local_90 = puVar102;
    local_68 = val;
LAB_018a9929:
    do {
      uVar108 = local_78 & 0xff;
      uVar64 = lVar85 * 4 + 0x20;
      local_50 = lVar85 * 4 + 0x10;
      puVar107 = puVar102;
      pyVar76 = pyVar66;
      sVar77 = uVar84;
LAB_018a995b:
      uVar101 = pyVar76->tag;
      bVar78 = (byte)uVar101 & 7;
      uVar70 = (uint)uVar108;
      uVar83 = (uint)lVar98;
      puVar102 = puVar107;
      sVar63 = sVar77;
      if (bVar78 == 4) {
        uVar84 = uVar64;
        if ((uVar83 & uVar70) != 0) {
          uVar84 = 0x20;
        }
        if (puVar107 <= (ulong *)((long)puVar103 + uVar84)) {
          uVar101 = sVar77 >> 1;
          if (sVar77 >> 1 <= uVar84) {
            uVar101 = uVar84;
          }
          sVar63 = (uVar101 + 0xf & 0xfffffffffffffff0) + sVar77;
          pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar77,sVar63);
          if (pbVar81 == (byte *)0x0) goto LAB_018af790;
          puVar102 = (ulong *)(pbVar81 + (sVar63 - ((long)local_90 - (long)puVar107)));
          memmove(puVar102,pbVar81 + ((long)puVar107 - (long)local_f8),
                  (long)local_90 - (long)puVar107);
          puVar103 = (uint *)(pbVar81 + ((long)puVar103 - (long)local_f8));
          local_90 = (ulong *)(pbVar81 + sVar63);
          local_f8 = pbVar81;
        }
        lVar87 = lVar85;
        puVar75 = puVar103;
        if (lVar85 != 0 && (uVar83 & uVar70) == 0) {
          do {
            puVar103 = (uint *)((long)puVar75 + lVar82);
            *puVar75 = 0x20202020;
            lVar87 = lVar87 + -1;
            puVar75 = puVar103;
          } while (lVar87 != 0);
        }
        pcVar59 = (char *)(pyVar76->uni).u64;
        uVar70 = (uint)((ulong)pcVar59 >> 0x20);
        if ((pyVar76->tag & 0x10) == 0) {
          uVar70 = uVar70 >> 0x1f & (uint)(pyVar76->tag >> 3);
          *(byte *)puVar103 = 0x2d;
          pcVar61 = (char *)-(long)pcVar59;
          if (uVar70 == 0) {
            pcVar61 = pcVar59;
          }
          pbVar81 = (byte *)((ulong)uVar70 + (long)puVar103);
          if (pcVar61 < (char *)0x5f5e100) {
            if (pcVar61 < (char *)0x64) {
              *(undefined2 *)pbVar81 =
                   *(undefined2 *)(digit_table + (ulong)(pcVar61 < (char *)0xa) + (long)pcVar61 * 2)
              ;
              puVar103 = (uint *)(pbVar81 + (2 - (ulong)(pcVar61 < (char *)0xa)));
            }
            else {
              iVar71 = (int)pcVar61;
              if (pcVar61 < (char *)0x2710) {
                uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar84 = (ulong)(pcVar61 < (char *)0x3e8);
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                puVar103 = (uint *)(pbVar81 + (4 - uVar84));
              }
              else if (pcVar61 < (char *)0xf4240) {
                iVar71 = (int)((ulong)((long)pcVar61 * 0x68db9) >> 0x20) * -10000 + iVar71;
                uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar84 = (ulong)(pcVar61 < (char *)0x186a0);
                *(undefined2 *)pbVar81 =
                     *(undefined2 *)
                      (digit_table + uVar84 + ((ulong)((long)pcVar61 * 0x68db9) >> 0x20) * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                puVar103 = (uint *)(pbVar81 + (6 - uVar84));
              }
              else {
                uVar70 = (uint)((ulong)((long)pcVar61 * 0x68db8bb) >> 0x20);
                uVar83 = uVar70 >> 8;
                iVar71 = uVar83 * -10000 + iVar71;
                uVar83 = uVar83 * 0x147b >> 0x13;
                uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar84 = (ulong)(pcVar61 < "cSt11char_traitsIcESaIcEEEDpT_");
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar83 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar84)) =
                     *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                *(undefined2 *)(pbVar81 + (6 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                puVar103 = (uint *)(pbVar81 + (8 - uVar84));
              }
            }
          }
          else {
            uVar84 = (ulong)pcVar61 / 100000000;
            pcVar59 = pcVar61 + uVar84 * 0xfa0a1f00;
            iVar71 = (int)uVar84;
            if (pcVar61 < (char *)0x2386f26fc10000) {
              if (pcVar61 < (char *)0x2540be400) {
                *(undefined2 *)pbVar81 =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar61 < (char *)0x3b9aca00) + uVar84 * 2);
                pbVar81 = pbVar81 + (2 - (ulong)(pcVar61 < (char *)0x3b9aca00));
              }
              else if (pcVar61 < (char *)0xe8d4a51000) {
                uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar84 = (ulong)(pcVar61 < (char *)0x174876e800);
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                pbVar81 = pbVar81 + (4 - uVar84);
              }
              else if (pcVar61 < (char *)0x5af3107a4000) {
                iVar71 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar71;
                uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar101 = (ulong)((ulong)pcVar61 >> 0xd < 0x48c27395);
                *(undefined2 *)pbVar81 =
                     *(undefined2 *)(digit_table + uVar101 + (uVar84 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar101)) =
                     *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar101)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                pbVar81 = pbVar81 + (6 - uVar101);
              }
              else {
                uVar70 = (uint)(uVar84 * 0x68db8bb >> 0x20);
                uVar83 = uVar70 >> 8;
                iVar71 = uVar83 * -10000 + iVar71;
                uVar83 = uVar83 * 0x147b >> 0x13;
                uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar84 = (ulong)(pcVar61 < (char *)0x38d7ea4c68000);
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar83 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar84)) =
                     *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                *(undefined2 *)(pbVar81 + (6 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                pbVar81 = pbVar81 + (8 - uVar84);
              }
              uVar70 = (uint)(((ulong)pcVar59 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar83 = uVar70 >> 8;
              iVar71 = uVar83 * -10000 + (int)pcVar59;
              uVar83 = uVar83 * 0x147b >> 0x13;
              uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
              *(undefined2 *)(pbVar81 + 2) =
                   *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
              *(undefined2 *)(pbVar81 + 4) = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
              *(undefined2 *)(pbVar81 + 6) =
                   *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2);
              puVar103 = (uint *)(pbVar81 + 8);
            }
            else {
              uVar84 = (ulong)pcVar61 / 1000000000000;
              iVar60 = (int)uVar84;
              if (pcVar61 < (char *)0xde0b6b3a7640000) {
                iVar91 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar60;
                uVar70 = (uint)(iVar91 * 0x147b) >> 0x13;
                uVar101 = (ulong)(pcVar61 < (char *)0x16345785d8a0000);
                *(undefined2 *)pbVar81 =
                     *(undefined2 *)(digit_table + uVar101 + (uVar84 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar101)) =
                     *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar101)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar91) * 2);
                lVar87 = 6 - uVar101;
              }
              else {
                uVar70 = (uint)(uVar84 / 10000);
                iVar91 = uVar70 * -10000 + iVar60;
                uVar70 = uVar70 / 100;
                uVar83 = (uint)(iVar91 * 0x147b) >> 0x13;
                uVar101 = (ulong)(pcVar61 < (char *)0x8ac7230489e80000);
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar101 + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar101)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + (int)(uVar84 / 10000)) * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar101)) =
                     *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                *(undefined2 *)(pbVar81 + (6 - uVar101)) =
                     *(undefined2 *)(digit_table + (uVar83 * -100 + iVar91) * 2);
                lVar87 = 8 - uVar101;
              }
              pbVar81 = pbVar81 + lVar87;
              iVar71 = iVar71 + iVar60 * -10000;
              uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
              *(undefined2 *)(pbVar81 + 2) =
                   *(undefined2 *)(digit_table + (uVar70 * 0x7fffff9c + iVar71) * 2);
              uVar70 = (uint)(((ulong)pcVar59 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar83 = uVar70 >> 8;
              iVar71 = uVar83 * -10000 + (int)pcVar59;
              uVar83 = uVar83 * 0x147b >> 0x13;
              uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar81 + 4) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
              *(undefined2 *)(pbVar81 + 6) =
                   *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
              *(undefined2 *)(pbVar81 + 8) = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
              *(undefined2 *)(pbVar81 + 10) =
                   *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2);
              puVar103 = (uint *)(pbVar81 + 0xc);
            }
          }
        }
        else {
          uVar84 = (ulong)pcVar59 & 0xfffffffffffff;
          uVar70 = uVar70 >> 0x14 & 0x7ff;
          if (uVar70 == 0x7ff) {
            if ((flg & 0x10) == 0) {
              if ((flg & 8) == 0) {
LAB_018af864:
                if (dat_len != (usize *)0x0) {
                  *dat_len = 0;
                }
                pyVar67 = &local_60;
                if (err != (yyjson_write_err *)0x0) {
                  pyVar67 = err;
                }
                pyVar68->code = 4;
                pyVar67->msg = "nan or inf number is not allowed";
                if (local_f8 == (byte *)0x0) {
                  return (char *)0x0;
                }
                (*p_Var5)(pvVar6,local_f8);
                return (char *)0x0;
              }
              if (uVar84 == 0) {
                *(byte *)puVar103 = 0x2d;
                puVar105 = (undefined8 *)((long)puVar103 - ((long)pcVar59 >> 0x3f));
                *puVar105 = 0x7974696e69666e49;
                puVar103 = (uint *)(puVar105 + 1);
              }
              else {
                *puVar103 = 0x4e614e;
                puVar103 = (uint *)((long)puVar103 + 3);
              }
            }
            else {
              *puVar103 = 0x6c6c756e;
              puVar103 = puVar103 + 1;
            }
          }
          else {
            *(byte *)puVar103 = 0x2d;
            lVar87 = -((long)pcVar59 >> 0x3f);
            puVar107 = (ulong *)((long)puVar103 + lVar87);
            if (((ulong)pcVar59 & 0x7fffffffffffffff) == 0) {
              *(undefined4 *)puVar107 = 0x302e30;
              puVar103 = (uint *)((long)puVar107 + 3);
            }
            else if (uVar70 == 0) {
              yyjson_mut_write_opts_impl();
              puVar103 = local_40;
            }
            else {
              uVar101 = uVar84 + 0x10000000000000;
              if (uVar70 - 0x3ff < 0x35) {
                lVar72 = 0;
                if (uVar101 != 0) {
                  for (; (uVar101 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                  }
                }
                if (0x433 - uVar70 <= (uint)lVar72) {
                  pcVar59 = (char *)(uVar101 >> ((byte)(0x433 - uVar70) & 0x3f));
                  if (pcVar59 < (char *)0x5f5e100) {
                    if (pcVar59 < (char *)0x64) {
                      *(undefined2 *)puVar107 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar59 < (char *)0xa) + (long)pcVar59 * 2);
                      pbVar81 = (byte *)((long)puVar107 + (2 - (ulong)(pcVar59 < (char *)0xa)));
                    }
                    else {
                      iVar71 = (int)pcVar59;
                      if (pcVar59 < (char *)0x2710) {
                        uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                        uVar84 = (ulong)(pcVar59 < (char *)0x3e8);
                        *(undefined2 *)puVar107 =
                             *(undefined2 *)(digit_table + uVar84 + (ulong)uVar70 * 2);
                        *(undefined2 *)((long)puVar107 + (2 - uVar84)) =
                             *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                        pbVar81 = (byte *)((long)puVar107 + (4 - uVar84));
                      }
                      else if (pcVar59 < (char *)0xf4240) {
                        iVar71 = (int)((ulong)((long)pcVar59 * 0x68db9) >> 0x20) * -10000 + iVar71;
                        uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                        uVar84 = (ulong)(pcVar59 < (char *)0x186a0);
                        *(undefined2 *)puVar107 =
                             *(undefined2 *)
                              (digit_table + uVar84 + ((ulong)((long)pcVar59 * 0x68db9) >> 0x20) * 2
                              );
                        *(undefined2 *)((long)puVar107 + (2 - uVar84)) =
                             *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                        *(undefined2 *)((long)puVar107 + (4 - uVar84)) =
                             *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                        pbVar81 = (byte *)((long)puVar107 + (6 - uVar84));
                      }
                      else {
                        uVar70 = (uint)((ulong)((long)pcVar59 * 0x68db8bb) >> 0x20);
                        uVar83 = uVar70 >> 8;
                        iVar71 = uVar83 * -10000 + iVar71;
                        uVar83 = uVar83 * 0x147b >> 0x13;
                        uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                        uVar84 = (ulong)(pcVar59 < "cSt11char_traitsIcESaIcEEEDpT_");
                        *(undefined2 *)puVar107 =
                             *(undefined2 *)(digit_table + uVar84 + (ulong)uVar83 * 2);
                        *(undefined2 *)((long)puVar107 + (2 - uVar84)) =
                             *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                        *(undefined2 *)((long)puVar107 + (4 - uVar84)) =
                             *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                        *(undefined2 *)((long)puVar107 + (6 - uVar84)) =
                             *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                        pbVar81 = (byte *)((long)puVar107 + (8 - uVar84));
                      }
                    }
                  }
                  else {
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = pcVar59;
                    uVar84 = SUB168(auVar15 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                    if (pcVar59 < (char *)0x2540be400) {
                      *(undefined2 *)puVar107 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar59 < (char *)0x3b9aca00) + uVar84 * 2);
                      pbVar81 = (byte *)((long)puVar107 +
                                        (2 - (ulong)(pcVar59 < (char *)0x3b9aca00)));
                    }
                    else {
                      iVar71 = (int)uVar84;
                      if (pcVar59 < (char *)0xe8d4a51000) {
                        uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                        uVar101 = (ulong)(pcVar59 < (char *)0x174876e800);
                        *(undefined2 *)puVar107 =
                             *(undefined2 *)(digit_table + uVar101 + (ulong)uVar70 * 2);
                        *(undefined2 *)((long)puVar107 + (2 - uVar101)) =
                             *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                        pbVar81 = (byte *)((long)puVar107 + (4 - uVar101));
                      }
                      else if (pcVar59 < (char *)0x5af3107a4000) {
                        iVar71 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar71;
                        uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                        uVar101 = (ulong)((ulong)pcVar59 >> 0xd < 0x48c27395);
                        *(undefined2 *)puVar107 =
                             *(undefined2 *)(digit_table + uVar101 + (uVar84 * 0x68db9 >> 0x20) * 2)
                        ;
                        *(undefined2 *)((long)puVar107 + (2 - uVar101)) =
                             *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                        *(undefined2 *)((long)puVar107 + (4 - uVar101)) =
                             *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                        pbVar81 = (byte *)((long)puVar107 + (6 - uVar101));
                      }
                      else {
                        uVar70 = (uint)(uVar84 * 0x68db8bb >> 0x20);
                        uVar83 = uVar70 >> 8;
                        iVar71 = uVar83 * -10000 + iVar71;
                        uVar83 = uVar83 * 0x147b >> 0x13;
                        uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                        uVar101 = (ulong)(pcVar59 < (char *)0x38d7ea4c68000);
                        *(undefined2 *)puVar107 =
                             *(undefined2 *)(digit_table + uVar101 + (ulong)uVar83 * 2);
                        *(undefined2 *)((long)puVar107 + (2 - uVar101)) =
                             *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                        *(undefined2 *)((long)puVar107 + (4 - uVar101)) =
                             *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                        *(undefined2 *)((long)puVar107 + (6 - uVar101)) =
                             *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                        pbVar81 = (byte *)((long)puVar107 + (8 - uVar101));
                      }
                    }
                    uVar70 = (uint)(((ulong)(pcVar59 + uVar84 * 0xfa0a1f00) & 0xffffffff) *
                                    0x68db8bb >> 0x20);
                    uVar83 = uVar70 >> 8;
                    iVar71 = uVar83 * -10000 + (int)(pcVar59 + uVar84 * 0xfa0a1f00);
                    uVar83 = uVar83 * 0x147b >> 0x13;
                    uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar81 + 2) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                    *(undefined2 *)(pbVar81 + 4) = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                    *(undefined2 *)(pbVar81 + 6) =
                         *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2);
                    pbVar81 = pbVar81 + 8;
                  }
                  pbVar81[0] = 0x2e;
                  pbVar81[1] = 0x30;
                  puVar103 = (uint *)(pbVar81 + 2);
                  goto LAB_018ab9d7;
                }
              }
              uVar79 = (ulong)((uint)pcVar59 & 1);
              iVar71 = uVar70 * 0x4d105 + -0x200a5;
              if (uVar70 == 1 || uVar84 != 0) {
                iVar71 = uVar70 * 0x4d105;
              }
              iVar71 = iVar71 + -0x1439b7ff >> 0x14;
              uVar86 = *(ulong *)(pow10_sig_table + (ulong)(iVar71 * -2 + 0x2ae) * 8);
              uVar99 = *(long *)(pow10_sig_table + (ulong)(iVar71 * -2 + 0x2af) * 8) +
                       (ulong)(iVar71 - 1U < 0xffffffc8);
              bVar78 = ((char)((uint)(iVar71 * -0x3526b) >> 0x10) + (char)uVar70) - 0x32;
              uVar84 = (ulong)(uVar70 != 1 && uVar84 == 0) + uVar101 * 4 + -2 << (bVar78 & 0x3f);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar99;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar84;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = SUB168(auVar9 * auVar30,8);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = uVar86;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar84;
              auVar48 = auVar10 * auVar31 + auVar48;
              uVar84 = uVar101 * 4 << (bVar78 & 0x3f);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = uVar99;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar84;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = SUB168(auVar11 * auVar32,8);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = uVar86;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar84;
              auVar49 = auVar12 * auVar33 + auVar49;
              uVar94 = auVar49._8_8_;
              uVar84 = uVar101 * 4 + 2 << (bVar78 & 0x3f);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = uVar99;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar84;
              auVar50._8_8_ = 0;
              auVar50._0_8_ = SUB168(auVar13 * auVar34,8);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = uVar86;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar84;
              auVar50 = auVar14 * auVar35 + auVar50;
              uVar84 = ((ulong)((auVar48 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0) | auVar48._8_8_) + uVar79;
              uVar79 = ((ulong)((auVar50 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0) | auVar50._8_8_) - uVar79;
              if (uVar94 < 0x28) {
LAB_018a9e0c:
                uVar86 = (auVar49 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                         uVar94;
                uVar101 = uVar94 & 0xfffffffffffffffc;
                bVar111 = true;
                if (uVar86 <= uVar101 + 2) {
                  bVar111 = (bool)((byte)((uVar94 & 0xffffffff) >> 2) & 0x3f & uVar86 == uVar101 + 2
                                  );
                }
                bVar110 = uVar101 + 4 <= uVar79;
                if (uVar101 < uVar84 == bVar110) {
                  bVar111 = bVar110;
                }
                uVar84 = (ulong)bVar111 + (uVar94 >> 2);
              }
              else {
                uVar86 = uVar94 / 0x28;
                uVar101 = uVar86 * 0x28 + 0x28;
                if (uVar86 * 0x28 < uVar84 != uVar101 <= uVar79) goto LAB_018a9e0c;
                uVar84 = (uVar86 + 1) - (ulong)(uVar79 < uVar101);
                iVar71 = iVar71 + 1;
              }
              iVar60 = (0x11 - (uint)(uVar84 < 10000000000000000)) -
                       (uint)(uVar84 < 1000000000000000);
              uVar70 = iVar60 + iVar71;
              local_48 = puVar107;
              local_38 = lVar87;
              if (iVar60 + iVar71 + 5U < 0x1b) {
                if ((int)uVar70 < 1) {
                  uVar101 = uVar84 / 100000000;
                  uVar83 = (uint)uVar101;
                  pbVar81 = (byte *)((long)puVar107 +
                                    (((ulong)(2 - uVar70) + 1) - (ulong)(uVar83 < 100000000)));
                  iVar91 = (int)((uVar101 & 0xffffffff) / 10000);
                  iVar60 = iVar91 * -10000 + uVar83;
                  uVar84 = uVar101 * 0xfa0a1f00 + uVar84;
                  iVar71 = (int)(((uVar101 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                  uVar96 = (uint)(iVar71 * 0x29) >> 0xc;
                  uVar93 = uVar96 * -100 + iVar71;
                  uVar88 = iVar71 * -100 + iVar91;
                  *(byte *)((long)puVar107 + (ulong)(2 - uVar70)) = (char)uVar96 + 0x30;
                  uVar101 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
                  *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar101 + uVar93 * 2);
                  *(undefined2 *)(pbVar81 + (2 - uVar101)) =
                       *(undefined2 *)(digit_table + uVar88 * 2);
                  iVar71 = (int)uVar84;
                  if (iVar71 == 0) {
                    if (iVar60 == 0) {
                      uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar93];
                      if (uVar88 != 0) {
                        uVar84 = 0;
                      }
                      uVar84 = uVar84 + (byte)dec_trailing_zero_table[uVar88];
                      lVar87 = 4;
                    }
                    else {
                      uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                      uVar88 = uVar83 * -100 + iVar60;
                      *(undefined2 *)(pbVar81 + (4 - uVar101)) =
                           *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                      *(undefined2 *)(pbVar81 + (6 - uVar101)) =
                           *(undefined2 *)(digit_table + uVar88 * 2);
                      uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar83] + 2;
                      if (uVar88 != 0) {
                        uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar88];
                      }
                      lVar87 = 8;
                    }
                    uVar84 = lVar87 - uVar84;
                  }
                  else {
                    uVar93 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar83 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar96 = uVar83 >> 8;
                    uVar88 = uVar96 * 0x147b >> 0x13;
                    uVar84 = (ulong)uVar88;
                    uVar83 = uVar88 * -100 + (uVar83 >> 8);
                    *(undefined2 *)(pbVar81 + (4 - uVar101)) =
                         *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                    *(undefined2 *)(pbVar81 + (6 - uVar101)) =
                         *(undefined2 *)(digit_table + (uVar93 * 0x7fffff9c + iVar60) * 2);
                    *(undefined2 *)(pbVar81 + (8 - uVar101)) =
                         *(undefined2 *)(digit_table + uVar84 * 2);
                    *(undefined2 *)(pbVar81 + (10 - uVar101)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    iVar71 = uVar96 * -10000 + iVar71;
                    if (iVar71 == 0) {
                      lVar87 = 0xc;
                    }
                    else {
                      uVar83 = (uint)(iVar71 * 0x147b) >> 0x13;
                      uVar84 = (ulong)uVar83;
                      uVar83 = uVar83 * -100 + iVar71;
                      *(undefined2 *)(pbVar81 + (0xc - uVar101)) =
                           *(undefined2 *)(digit_table + uVar84 * 2);
                      *(undefined2 *)(pbVar81 + (0xe - uVar101)) =
                           *(undefined2 *)(digit_table + uVar83 * 2);
                      lVar87 = 0x10;
                    }
                    uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar84] + 2;
                    if (uVar83 != 0) {
                      uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                    }
                    uVar84 = lVar87 - uVar84;
                  }
                  *(undefined2 *)puVar107 = 0x2e30;
                  puVar103 = (uint *)(pbVar81 + ((uVar84 & 0xffffffff) - uVar101));
                  if ((int)uVar70 < 0) {
                    switchD_012e5a64::default((byte *)((long)puVar107 + 2),0x30,(ulong)-uVar70);
                  }
                }
                else {
                  uVar101 = uVar84 / 100000000;
                  uVar83 = (uint)uVar101;
                  pbVar81 = (byte *)((long)puVar107 + (2 - (ulong)(uVar83 < 100000000)));
                  iVar91 = (int)((uVar101 & 0xffffffff) / 10000);
                  iVar60 = iVar91 * -10000 + uVar83;
                  uVar84 = uVar101 * 0xfa0a1f00 + uVar84;
                  iVar71 = (int)(((uVar101 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                  uVar96 = (uint)(iVar71 * 0x29) >> 0xc;
                  uVar93 = uVar96 * -100 + iVar71;
                  uVar88 = iVar71 * -100 + iVar91;
                  *puVar107 = 0x3030303030303030;
                  puVar107[1] = 0x3030303030303030;
                  puVar107[2] = 0x3030303030303030;
                  *(byte *)((long)puVar107 + 1) = (char)uVar96 + 0x30;
                  uVar101 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
                  *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar101 + uVar93 * 2);
                  *(undefined2 *)(pbVar81 + (2 - uVar101)) =
                       *(undefined2 *)(digit_table + uVar88 * 2);
                  iVar71 = (int)uVar84;
                  if (iVar71 == 0) {
                    if (iVar60 == 0) {
                      uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar93];
                      if (uVar88 != 0) {
                        uVar84 = 0;
                      }
                      uVar84 = uVar84 + (byte)dec_trailing_zero_table[uVar88];
                      lVar72 = 4;
                    }
                    else {
                      uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                      uVar88 = uVar83 * -100 + iVar60;
                      *(undefined2 *)(pbVar81 + (4 - uVar101)) =
                           *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                      *(undefined2 *)(pbVar81 + (6 - uVar101)) =
                           *(undefined2 *)(digit_table + uVar88 * 2);
                      uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar83] + 2;
                      if (uVar88 != 0) {
                        uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar88];
                      }
                      lVar72 = 8;
                    }
                    uVar84 = lVar72 - uVar84;
                  }
                  else {
                    uVar93 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar83 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar96 = uVar83 >> 8;
                    uVar88 = uVar96 * 0x147b >> 0x13;
                    uVar84 = (ulong)uVar88;
                    uVar83 = uVar88 * -100 + (uVar83 >> 8);
                    *(undefined2 *)(pbVar81 + (4 - uVar101)) =
                         *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                    *(undefined2 *)(pbVar81 + (6 - uVar101)) =
                         *(undefined2 *)(digit_table + (uVar93 * 0x7fffff9c + iVar60) * 2);
                    *(undefined2 *)(pbVar81 + (8 - uVar101)) =
                         *(undefined2 *)(digit_table + uVar84 * 2);
                    *(undefined2 *)(pbVar81 + (10 - uVar101)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    iVar71 = uVar96 * -10000 + iVar71;
                    if (iVar71 == 0) {
                      lVar72 = 0xc;
                    }
                    else {
                      uVar83 = (uint)(iVar71 * 0x147b) >> 0x13;
                      uVar84 = (ulong)uVar83;
                      uVar83 = uVar83 * -100 + iVar71;
                      *(undefined2 *)(pbVar81 + (0xc - uVar101)) =
                           *(undefined2 *)(digit_table + uVar84 * 2);
                      *(undefined2 *)(pbVar81 + (0xe - uVar101)) =
                           *(undefined2 *)(digit_table + uVar83 * 2);
                      lVar72 = 0x10;
                    }
                    uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar84] + 2;
                    if (uVar83 != 0) {
                      uVar84 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                    }
                    uVar84 = lVar72 - uVar84;
                  }
                  uVar79 = 0;
                  do {
                    *(byte *)((long)puVar103 + uVar79 + lVar87) =
                         *(byte *)((long)puVar103 + uVar79 + lVar87 + 1);
                    uVar79 = uVar79 + 1;
                  } while (uVar70 != uVar79);
                  pbVar109 = (byte *)((long)puVar107 + (ulong)uVar70);
                  puVar103 = (uint *)(pbVar109 + 2);
                  *pbVar109 = 0x2e;
                  if (puVar103 < pbVar81 + ((uVar84 & 0xffffffff) - uVar101)) {
                    puVar103 = (uint *)(pbVar81 + ((uVar84 & 0xffffffff) - uVar101));
                  }
                }
              }
              else {
                uVar101 = uVar84 / 100000000;
                uVar83 = (uint)uVar101;
                lVar87 = 2 - (ulong)(uVar83 < 100000000);
                iVar91 = (int)((uVar101 & 0xffffffff) / 10000);
                iVar60 = iVar91 * -10000 + uVar83;
                uVar84 = uVar101 * 0xfa0a1f00 + uVar84;
                iVar71 = (int)(((uVar101 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar96 = (uint)(iVar71 * 0x29) >> 0xc;
                uVar93 = uVar96 * -100 + iVar71;
                uVar88 = iVar71 * -100 + iVar91;
                *(byte *)((long)puVar107 + 1) = (char)uVar96 + 0x30;
                uVar101 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
                *(undefined2 *)((long)puVar107 + lVar87) =
                     *(undefined2 *)(digit_table + uVar101 + uVar93 * 2);
                lVar87 = lVar87 - uVar101;
                *(undefined2 *)((long)puVar107 + lVar87 + 2) =
                     *(undefined2 *)(digit_table + uVar88 * 2);
                iVar71 = (int)uVar84;
                if (iVar71 == 0) {
                  if (iVar60 == 0) {
                    uVar83 = (uint)(byte)dec_trailing_zero_table[uVar93];
                    if (uVar88 != 0) {
                      uVar83 = 0;
                    }
                    uVar83 = uVar83 + (byte)dec_trailing_zero_table[uVar88];
                    iVar71 = 4;
                  }
                  else {
                    uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar88 = uVar83 * -100 + iVar60;
                    *(undefined2 *)((long)puVar107 + lVar87 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)((long)puVar107 + lVar87 + 6) =
                         *(undefined2 *)(digit_table + uVar88 * 2);
                    uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
                    if (uVar88 != 0) {
                      uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                    }
                    iVar71 = 8;
                  }
                  uVar83 = iVar71 - uVar83;
                }
                else {
                  uVar96 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar83 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar97 = uVar83 >> 8;
                  uVar93 = uVar97 * 0x147b >> 0x13;
                  uVar88 = uVar93 * -100 + (uVar83 >> 8);
                  *(undefined2 *)((long)puVar107 + lVar87 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar96 * 2);
                  *(undefined2 *)((long)puVar107 + lVar87 + 6) =
                       *(undefined2 *)(digit_table + (uVar96 * 0x7fffff9c + iVar60) * 2);
                  *(undefined2 *)((long)puVar107 + lVar87 + 8) =
                       *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                  *(undefined2 *)((long)puVar107 + lVar87 + 10) =
                       *(undefined2 *)(digit_table + uVar88 * 2);
                  iVar71 = uVar97 * -10000 + iVar71;
                  if (iVar71 == 0) {
                    uVar83 = (byte)dec_trailing_zero_table[uVar93] + 2;
                    if (uVar88 != 0) {
                      uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                    }
                    iVar71 = 0xc;
                  }
                  else {
                    uVar83 = (uint)(iVar71 * 0x147b) >> 0x13;
                    uVar88 = uVar83 * -100 + iVar71;
                    *(undefined2 *)((long)puVar107 + lVar87 + 0xc) =
                         *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)((long)puVar107 + lVar87 + 0xe) =
                         *(undefined2 *)(digit_table + uVar88 * 2);
                    uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
                    if (uVar88 != 0) {
                      uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                    }
                    iVar71 = 0x10;
                  }
                  uVar83 = iVar71 - uVar83;
                }
                pbVar81 = (byte *)((long)puVar107 +
                                  (((ulong)uVar83 + lVar87) - (ulong)((ulong)uVar83 + lVar87 == 2)))
                ;
                uVar70 = uVar70 - 1;
                *(byte *)puVar107 = *(byte *)((long)puVar107 + 1);
                *(byte *)((long)puVar107 + 1) = 0x2e;
                pbVar81[0] = 0x65;
                pbVar81[1] = 0x2d;
                uVar88 = uVar70 >> 0x1f;
                pbVar109 = pbVar81 + (ulong)uVar88 + 1;
                uVar83 = -uVar70;
                if (0 < (int)uVar70) {
                  uVar83 = uVar70;
                }
                if (uVar83 < 100) {
                  *(undefined2 *)pbVar109 =
                       *(undefined2 *)(digit_table + (ulong)(uVar83 < 10) + (ulong)uVar83 * 2);
                  puVar103 = (uint *)(pbVar109 + (2 - (ulong)(uVar83 < 10)));
                }
                else {
                  *pbVar109 = (char)(uVar83 * 0x290 >> 0x10) + 0x30;
                  *(undefined2 *)(pbVar81 + (ulong)uVar88 + 2) =
                       *(undefined2 *)
                        (digit_table + ((uVar83 * 0x290 >> 0x10) * 0x7fffff9c + uVar83) * 2);
                  puVar103 = (uint *)(pbVar81 + (ulong)uVar88 + 4);
                }
              }
            }
          }
        }
LAB_018ab9d7:
        *(ushort *)puVar103 = 0xa2c;
        puVar103 = (uint *)((long)puVar103 + 2);
LAB_018ab9e1:
        lVar98 = lVar98 + -1;
        lVar87 = lVar85;
        if (lVar98 == 0) goto LAB_018ac912;
        pyVar76 = pyVar76->next;
        puVar107 = puVar102;
        sVar77 = sVar63;
        goto LAB_018a995b;
      }
      if (((uint)uVar101 & 7) == 5) {
        uVar79 = uVar101 >> 8;
        puVar75 = (uint *)(pyVar76->uni).str;
        uVar84 = local_50;
        if ((uVar83 & uVar70) != 0) {
          uVar84 = 0x10;
        }
        uVar84 = uVar84 + uVar79 * 6;
        if (puVar107 <= (ulong *)((long)puVar103 + uVar84)) {
          uVar86 = sVar77 >> 1;
          if (sVar77 >> 1 <= uVar84) {
            uVar86 = uVar84;
          }
          sVar63 = (uVar86 + 0xf & 0xfffffffffffffff0) + sVar77;
          pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar77,sVar63);
          if (pbVar81 == (byte *)0x0) goto LAB_018af790;
          local_48 = (ulong *)(pbVar81 + (sVar63 - ((long)local_90 - (long)puVar107)));
          memmove(local_48,pbVar81 + ((long)puVar107 - (long)local_f8),
                  (long)local_90 - (long)puVar107);
          puVar103 = (uint *)(pbVar81 + ((long)puVar103 - (long)local_f8));
          local_90 = (ulong *)(pbVar81 + sVar63);
          puVar107 = local_48;
          local_f8 = pbVar81;
        }
        lVar87 = lVar85;
        puVar80 = puVar103;
        if (lVar85 != 0 && (uVar70 & uVar83) == 0) {
          do {
            puVar103 = (uint *)((long)puVar80 + lVar82);
            *puVar80 = 0x20202020;
            lVar87 = lVar87 + -1;
            puVar80 = puVar103;
          } while (lVar87 != 0);
        }
        if (local_d0 != (uint *)enc_table_cpy) {
          puVar80 = (uint *)(uVar79 + (long)puVar75);
          *(byte *)puVar103 = 0x22;
LAB_018abb63:
          lVar87 = (long)puVar80 - (long)puVar75;
          if (0xf < lVar87) {
            lVar72 = 0;
            do {
              puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
              puVar62 = (uint *)((long)puVar75 + lVar72);
              bVar78 = *(byte *)((long)puVar75 + lVar72);
              if (*(char *)((long)local_d0 + (ulong)bVar78) != '\0') goto LAB_018abe1d;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 1)) != '\0')
              {
                puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
                puVar62 = (uint *)((long)puVar75 + lVar72);
                goto LAB_018abda9;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 2)) != '\0')
              {
                puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
                puVar62 = (uint *)((long)puVar75 + lVar72);
                goto LAB_018abdc3;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 3)) != '\0')
              {
                puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
                puVar62 = (uint *)((long)puVar75 + lVar72);
                goto LAB_018abde3;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 4)) != '\0')
              {
                puVar62 = (uint *)((byte *)((long)puVar75 + lVar72) + 4);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 5);
                *(undefined4 *)((long)puVar103 + lVar72 + 1) =
                     *(undefined4 *)((long)puVar75 + lVar72);
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 5)) != '\0')
              {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 5);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 6);
                *(byte *)((long)puVar57 + -1) = pbVar81[4];
                *(undefined4 *)((long)puVar57 + -5) = *(undefined4 *)pbVar81;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 6)) != '\0')
              {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 6);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 7);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar81 + 4);
                *(undefined4 *)((long)puVar57 + -6) = *(undefined4 *)pbVar81;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 7)) != '\0')
              {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 7);
                uVar3 = *(undefined4 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 8);
                *(undefined4 *)((long)puVar103 + lVar72 + 4) = *(undefined4 *)(pbVar81 + 3);
                *(undefined4 *)((long)puVar103 + lVar72 + 1) = uVar3;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 8)) != '\0')
              {
                puVar62 = (uint *)((byte *)((long)puVar75 + lVar72) + 8);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 9);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) =
                     *(undefined8 *)((long)puVar75 + lVar72);
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 9)) != '\0')
              {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 9);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 10);
                *(byte *)((long)puVar57 + -1) = pbVar81[8];
                *(undefined8 *)((long)puVar57 + -9) = *(undefined8 *)pbVar81;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 10)) != '\0')
              {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 10);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xb);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar81 + 8);
                *(undefined8 *)((long)puVar57 + -10) = *(undefined8 *)pbVar81;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 0xb)) != '\0'
                 ) {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xb);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xc);
                puVar57[-1] = *(uint *)(pbVar81 + 7);
                *(undefined8 *)((long)puVar57 + -0xb) = *(undefined8 *)pbVar81;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 0xc)) != '\0'
                 ) {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xc);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xd);
                puVar57[-1] = *(uint *)(pbVar81 + 8);
                *(undefined8 *)(puVar57 + -3) = *(undefined8 *)pbVar81;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 0xd)) != '\0'
                 ) {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xd);
                uVar73 = *(undefined8 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xe);
                *(undefined8 *)((long)puVar103 + lVar72 + 6) = *(undefined8 *)(pbVar81 + 5);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) = uVar73;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 0xe)) != '\0'
                 ) {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xe);
                uVar73 = *(undefined8 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xf);
                *(undefined8 *)((long)puVar103 + lVar72 + 7) = *(undefined8 *)(pbVar81 + 6);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) = uVar73;
                goto LAB_018abe1d;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar75 + lVar72 + 0xf)) != '\0'
                 ) {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xf);
                uVar73 = *(undefined8 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0x10);
                *(undefined8 *)((long)puVar103 + lVar72 + 8) = *(undefined8 *)(pbVar81 + 7);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) = uVar73;
                goto LAB_018abe1d;
              }
              uVar73 = *(undefined8 *)(puVar62 + 2);
              *(undefined8 *)puVar57 = *(undefined8 *)puVar62;
              *(undefined8 *)((long)puVar103 + lVar72 + 9) = uVar73;
              lVar72 = lVar72 + 0x10;
              lVar87 = lVar87 + -0x10;
            } while (0xf < lVar87);
            puVar103 = (uint *)((long)puVar103 + lVar72);
            puVar75 = (uint *)((long)puVar75 + lVar72);
          }
          puVar57 = (uint *)((long)puVar103 + 1);
          puVar62 = puVar75;
          if (3 < lVar87) {
            lVar87 = (long)puVar80 - (long)puVar75;
            do {
              bVar78 = (byte)*puVar62;
              if (*(char *)((long)local_d0 + (ulong)bVar78) != '\0') goto LAB_018abe1d;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar62 + 1)) != '\0')
              goto LAB_018abda9;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar62 + 2)) != '\0')
              goto LAB_018abdc3;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar62 + 3)) != '\0')
              goto LAB_018abde3;
              *puVar57 = *puVar62;
              puVar57 = puVar57 + 1;
              puVar62 = puVar62 + 1;
              lVar87 = lVar87 + -4;
            } while (3 < lVar87);
          }
          if (puVar62 < puVar80) {
            while (uVar88 = *puVar62, *(char *)((long)local_d0 + (ulong)(byte)uVar88) == '\0') {
              puVar62 = (uint *)((long)puVar62 + 1);
              *(byte *)puVar57 = (byte)uVar88;
              puVar57 = (uint *)((long)puVar57 + 1);
              if (puVar80 <= puVar62) goto switchD_018aa0f3_default;
            }
            goto LAB_018abe1d;
          }
          goto switchD_018aa0f3_default;
        }
        uVar58 = pyVar76->tag;
        *(byte *)puVar103 = 0x22;
        if ((uVar58 & 0x18) == 0) {
          puVar80 = (uint *)(uVar79 + (long)puVar75);
LAB_018a9e64:
          lVar87 = (long)puVar80 - (long)puVar75;
          if (0xf < lVar87) {
            lVar72 = 0;
            do {
              puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
              puVar62 = (uint *)((long)puVar75 + lVar72);
              bVar78 = *(byte *)((long)puVar75 + lVar72);
              if (enc_table_cpy[bVar78] != '\0') goto LAB_018aa0c6;
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 1)] != '\0') {
                puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
                puVar62 = (uint *)((long)puVar75 + lVar72);
                goto LAB_018aa069;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 2)] != '\0') {
                puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
                puVar62 = (uint *)((long)puVar75 + lVar72);
                goto LAB_018aa07e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 3)] != '\0') {
                puVar57 = (uint *)((long)puVar103 + lVar72 + 1);
                puVar62 = (uint *)((long)puVar75 + lVar72);
                goto LAB_018aa099;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 4)] != '\0') {
                puVar62 = (uint *)((byte *)((long)puVar75 + lVar72) + 4);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 5);
                *(undefined4 *)((long)puVar103 + lVar72 + 1) =
                     *(undefined4 *)((long)puVar75 + lVar72);
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 5)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 5);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 6);
                *(byte *)((long)puVar57 + -1) = pbVar81[4];
                *(undefined4 *)((long)puVar57 + -5) = *(undefined4 *)pbVar81;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 6)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 6);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 7);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar81 + 4);
                *(undefined4 *)((long)puVar57 + -6) = *(undefined4 *)pbVar81;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 7)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 7);
                uVar3 = *(undefined4 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 8);
                *(undefined4 *)((long)puVar103 + lVar72 + 4) = *(undefined4 *)(pbVar81 + 3);
                *(undefined4 *)((long)puVar103 + lVar72 + 1) = uVar3;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 8)] != '\0') {
                puVar62 = (uint *)((byte *)((long)puVar75 + lVar72) + 8);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 9);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) =
                     *(undefined8 *)((long)puVar75 + lVar72);
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 9)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 9);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 10);
                *(byte *)((long)puVar57 + -1) = pbVar81[8];
                *(undefined8 *)((long)puVar57 + -9) = *(undefined8 *)pbVar81;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 10)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 10);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xb);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar81 + 8);
                *(undefined8 *)((long)puVar57 + -10) = *(undefined8 *)pbVar81;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 0xb)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xb);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xc);
                puVar57[-1] = *(uint *)(pbVar81 + 7);
                *(undefined8 *)((long)puVar57 + -0xb) = *(undefined8 *)pbVar81;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 0xc)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xc);
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xd);
                puVar57[-1] = *(uint *)(pbVar81 + 8);
                *(undefined8 *)(puVar57 + -3) = *(undefined8 *)pbVar81;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 0xd)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xd);
                uVar73 = *(undefined8 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xe);
                *(undefined8 *)((long)puVar103 + lVar72 + 6) = *(undefined8 *)(pbVar81 + 5);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) = uVar73;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 0xe)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xe);
                uVar73 = *(undefined8 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0xf);
                *(undefined8 *)((long)puVar103 + lVar72 + 7) = *(undefined8 *)(pbVar81 + 6);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) = uVar73;
                goto LAB_018aa0c6;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar72 + 0xf)] != '\0') {
                pbVar81 = (byte *)((long)puVar75 + lVar72);
                puVar62 = (uint *)(pbVar81 + 0xf);
                uVar73 = *(undefined8 *)pbVar81;
                puVar57 = (uint *)((long)puVar103 + lVar72 + 0x10);
                *(undefined8 *)((long)puVar103 + lVar72 + 8) = *(undefined8 *)(pbVar81 + 7);
                *(undefined8 *)((long)puVar103 + lVar72 + 1) = uVar73;
                goto LAB_018aa0c6;
              }
              uVar73 = *(undefined8 *)(puVar62 + 2);
              *(undefined8 *)puVar57 = *(undefined8 *)puVar62;
              *(undefined8 *)((long)puVar103 + lVar72 + 9) = uVar73;
              lVar72 = lVar72 + 0x10;
              lVar87 = lVar87 + -0x10;
            } while (0xf < lVar87);
            puVar103 = (uint *)((long)puVar103 + lVar72);
            puVar75 = (uint *)((long)puVar75 + lVar72);
          }
          puVar57 = (uint *)((long)puVar103 + 1);
          puVar62 = puVar75;
          if (3 < lVar87) {
            lVar87 = (long)puVar80 - (long)puVar75;
            do {
              bVar78 = (byte)*puVar62;
              if (enc_table_cpy[bVar78] != '\0') goto LAB_018aa0c6;
              if (enc_table_cpy[*(byte *)((long)puVar62 + 1)] != '\0') goto LAB_018aa069;
              if (enc_table_cpy[*(byte *)((long)puVar62 + 2)] != '\0') goto LAB_018aa07e;
              if (enc_table_cpy[*(byte *)((long)puVar62 + 3)] != '\0') goto LAB_018aa099;
              *puVar57 = *puVar62;
              puVar57 = puVar57 + 1;
              puVar62 = puVar62 + 1;
              lVar87 = lVar87 + -4;
            } while (3 < lVar87);
          }
          if (puVar62 < puVar80) {
            while (uVar88 = *puVar62, enc_table_cpy[(byte)uVar88] == '\0') {
              puVar62 = (uint *)((long)puVar62 + 1);
              *(byte *)puVar57 = (byte)uVar88;
              puVar57 = (uint *)((long)puVar57 + 1);
              if (puVar80 <= puVar62) goto switchD_018aa0f3_default;
            }
            goto LAB_018aa0c6;
          }
          goto switchD_018aa0f3_default;
        }
        puVar57 = (uint *)((long)puVar103 + 1);
        if (0xfff < uVar101) {
          do {
            uVar73 = *(undefined8 *)(puVar75 + 2);
            *(undefined8 *)puVar57 = *(undefined8 *)puVar75;
            *(undefined8 *)(puVar57 + 2) = uVar73;
            puVar57 = puVar57 + 4;
            puVar75 = puVar75 + 4;
            uVar79 = uVar79 - 0x10;
          } while (0xf < uVar79);
        }
        for (; 3 < uVar79; uVar79 = uVar79 - 4) {
          *puVar57 = *puVar75;
          puVar57 = puVar57 + 1;
          puVar75 = puVar75 + 1;
        }
        if (uVar79 != 0) {
          uVar84 = 0;
          do {
            *(byte *)((long)puVar57 + uVar84) = *(byte *)((long)puVar75 + uVar84);
            uVar84 = uVar84 + 1;
          } while (uVar79 != uVar84);
          puVar57 = (uint *)((long)puVar57 + uVar84);
        }
switchD_018aa0f3_default:
        bVar111 = (~uVar83 & uVar70) == 0;
        *(byte *)puVar57 = 0x22;
        bVar78 = 0x3a;
        if (bVar111) {
          bVar78 = 0x2c;
        }
        *(byte *)((long)puVar57 + 1) = bVar78;
        bVar78 = 0x20;
        if (bVar111) {
          bVar78 = 10;
        }
        *(byte *)((long)puVar57 + 2) = bVar78;
        puVar103 = (uint *)((long)puVar57 + 3);
        puVar102 = puVar107;
        goto LAB_018ab9e1;
      }
      if ((~(byte)uVar101 & 6) != 0) {
        if (bVar78 == 1) {
          uVar101 = uVar101 >> 8;
          puVar102 = (ulong *)(pyVar76->uni).ptr;
          if (puVar107 <= (ulong *)((long)puVar103 + uVar101 + 3)) {
            uVar84 = sVar77 >> 1;
            if (sVar77 >> 1 <= uVar101 + 3) {
              uVar84 = uVar101 + 3;
            }
            sVar63 = (uVar84 + 0xf & 0xfffffffffffffff0) + sVar77;
            local_48 = puVar102;
            pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar77,sVar63);
            if (pbVar81 == (byte *)0x0) goto LAB_018af790;
            sVar74 = (long)local_90 - (long)puVar107;
            memmove(pbVar81 + (sVar63 - sVar74),pbVar81 + ((long)puVar107 - (long)local_f8),sVar74);
            puVar103 = (uint *)(pbVar81 + ((long)puVar103 - (long)local_f8));
            local_90 = (ulong *)(pbVar81 + sVar63);
            puVar107 = (ulong *)(pbVar81 + (sVar63 - sVar74));
            sVar77 = sVar63;
            puVar102 = local_48;
            local_f8 = pbVar81;
          }
          switchD_012bc561::default(puVar103,puVar102,uVar101);
          pbVar81 = (byte *)((long)puVar103 + uVar101);
          puVar103 = (uint *)(pbVar81 + 2);
          pbVar81[0] = 0x2c;
          pbVar81[1] = 10;
          puVar102 = puVar107;
          sVar63 = sVar77;
        }
        else if (bVar78 == 2) {
          uVar84 = local_50;
          if ((uVar83 & uVar70) != 0) {
            uVar84 = 0x10;
          }
          if (puVar107 <= (ulong *)((long)puVar103 + uVar84)) {
            uVar101 = sVar77 >> 1;
            if (sVar77 >> 1 <= uVar84) {
              uVar101 = uVar84;
            }
            sVar63 = (uVar101 + 0xf & 0xfffffffffffffff0) + sVar77;
            pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar77,sVar63);
            if (pbVar81 == (byte *)0x0) goto LAB_018af790;
            puVar102 = (ulong *)(pbVar81 + (sVar63 - ((long)local_90 - (long)puVar107)));
            memmove(puVar102,pbVar81 + ((long)puVar107 - (long)local_f8),
                    (long)local_90 - (long)puVar107);
            puVar103 = (uint *)(pbVar81 + ((long)puVar103 - (long)local_f8));
            local_90 = (ulong *)(pbVar81 + sVar63);
            local_f8 = pbVar81;
          }
          lVar87 = lVar85;
          puVar75 = puVar103;
          if (lVar85 != 0 && (uVar83 & uVar70) == 0) {
            do {
              puVar103 = (uint *)((long)puVar75 + lVar82);
              *puVar75 = 0x20202020;
              lVar87 = lVar87 + -1;
              puVar75 = puVar103;
            } while (lVar87 != 0);
          }
          puVar103[0] = 0x6c6c756e;
          puVar103[1] = 0xa2c;
          puVar103 = (uint *)((long)puVar103 + 6);
        }
        else {
          if (bVar78 != 3) goto LAB_018af828;
          uVar84 = local_50;
          if ((uVar83 & uVar70) != 0) {
            uVar84 = 0x10;
          }
          if (puVar107 <= (ulong *)((long)puVar103 + uVar84)) {
            uVar101 = sVar77 >> 1;
            if (sVar77 >> 1 <= uVar84) {
              uVar101 = uVar84;
            }
            sVar63 = (uVar101 + 0xf & 0xfffffffffffffff0) + sVar77;
            pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar77,sVar63);
            if (pbVar81 == (byte *)0x0) goto LAB_018af790;
            puVar102 = (ulong *)(pbVar81 + (sVar63 - ((long)local_90 - (long)puVar107)));
            memmove(puVar102,pbVar81 + ((long)puVar107 - (long)local_f8),
                    (long)local_90 - (long)puVar107);
            puVar103 = (uint *)(pbVar81 + ((long)puVar103 - (long)local_f8));
            local_90 = (ulong *)(pbVar81 + sVar63);
            local_f8 = pbVar81;
          }
          lVar87 = lVar85;
          puVar75 = puVar103;
          if (lVar85 != 0 && (uVar83 & uVar70) == 0) {
            do {
              puVar103 = (uint *)((long)puVar75 + lVar82);
              *puVar75 = 0x20202020;
              lVar87 = lVar87 + -1;
              puVar75 = puVar103;
            } while (lVar87 != 0);
          }
          bVar111 = (pyVar76->tag & 0x18) != 0;
          uVar73 = 0xa2c65736c6166;
          if (bVar111) {
            uVar73 = 0xa2c65757274;
          }
          *(undefined8 *)puVar103 = uVar73;
          puVar103 = (uint *)((long)puVar103 + (7 - (ulong)bVar111));
        }
        goto LAB_018ab9e1;
      }
      if (uVar101 < 0x100) {
        uVar84 = local_50;
        if ((uVar83 & uVar70) != 0) {
          uVar84 = 0x10;
        }
        if (puVar107 <= (ulong *)((long)puVar103 + uVar84)) {
          uVar101 = sVar77 >> 1;
          if (sVar77 >> 1 <= uVar84) {
            uVar101 = uVar84;
          }
          sVar63 = (uVar101 + 0xf & 0xfffffffffffffff0) + sVar77;
          pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar77,sVar63);
          if (pbVar81 == (byte *)0x0) goto LAB_018af790;
          puVar102 = (ulong *)(pbVar81 + (sVar63 - ((long)local_90 - (long)puVar107)));
          memmove(puVar102,pbVar81 + ((long)puVar107 - (long)local_f8),
                  (long)local_90 - (long)puVar107);
          puVar103 = (uint *)(pbVar81 + ((long)puVar103 - (long)local_f8));
          local_90 = (ulong *)(pbVar81 + sVar63);
          local_f8 = pbVar81;
        }
        lVar87 = lVar85;
        puVar75 = puVar103;
        if (lVar85 != 0 && (uVar83 & uVar70) == 0) {
          do {
            puVar103 = (uint *)((long)puVar75 + lVar82);
            *puVar75 = 0x20202020;
            lVar87 = lVar87 + -1;
            puVar75 = puVar103;
          } while (lVar87 != 0);
        }
        bVar78 = (bVar78 == 7) * ' ';
        *(byte *)puVar103 = bVar78 + 0x5b;
        *(byte *)((long)puVar103 + 1) = bVar78 | 0x5d;
        *(ushort *)((long)puVar103 + 2) = 0xa2c;
        puVar103 = puVar103 + 1;
        goto LAB_018ab9e1;
      }
      local_78 = (ulong)(bVar78 == 7);
      if ((uVar83 & uVar70) != 0) {
        uVar64 = 0x20;
      }
      uVar84 = sVar77;
      if (puVar107 <= (ulong *)((long)puVar103 + uVar64)) {
        uVar84 = sVar77 >> 1;
        if (sVar77 >> 1 <= uVar64) {
          uVar84 = uVar64;
        }
        uVar84 = (uVar84 + 0xf & 0xfffffffffffffff0) + sVar77;
        pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar77,uVar84);
        if (pbVar81 == (byte *)0x0) goto LAB_018af790;
        puVar102 = (ulong *)(pbVar81 + (uVar84 - ((long)local_90 - (long)puVar107)));
        memmove(puVar102,pbVar81 + ((long)puVar107 - (long)local_f8),(long)local_90 - (long)puVar107
               );
        puVar103 = (uint *)(pbVar81 + ((long)puVar103 - (long)local_f8));
        local_90 = (ulong *)(pbVar81 + uVar84);
        local_f8 = pbVar81;
      }
      puVar102[-2] = uVar108 + lVar98 * 2;
      lVar98 = (uVar101 >> 8) << (bVar78 == 7);
      puVar102[-1] = (ulong)local_68;
      lVar87 = lVar85;
      puVar75 = puVar103;
      if (lVar85 != 0 && (uVar83 & uVar70) == 0) {
        do {
          puVar103 = (uint *)((long)puVar75 + lVar82);
          *puVar75 = 0x20202020;
          lVar87 = lVar87 + -1;
          puVar75 = puVar103;
        } while (lVar87 != 0);
      }
      *(byte *)puVar103 = (bVar78 == 7) << 5 | 0x5b;
      *(byte *)((long)puVar103 + 1) = 10;
      uVar58 = (pyVar76->uni).u64;
      if (bVar78 == 7) {
        uVar58 = *(uint64_t *)(uVar58 + 0x10);
      }
      puVar102 = puVar102 + -2;
      lVar85 = lVar85 + 1;
      puVar103 = (uint *)((long)puVar103 + 2);
      pyVar66 = *(yyjson_mut_val **)(uVar58 + 0x10);
      local_68 = pyVar76;
    } while( true );
  }
  if ((flg & 2) == 0) {
    puVar100 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar100 = enc_table_cpy;
    }
    switch(bVar78 & 7) {
    case 0:
      goto switchD_018a97fc_caseD_0;
    case 1:
switchD_018a97fc_caseD_1:
      uVar84 = uVar84 >> 8;
      pvVar8 = (val->uni).ptr;
      puVar103 = (uint *)(*p_Var4)(pvVar6,uVar84 + 2);
      if (puVar103 != (uint *)0x0) {
        switchD_012bc561::default(puVar103,pvVar8,uVar84);
        local_40 = (uint *)((long)puVar103 + uVar84);
        goto LAB_018afb79;
      }
      break;
    case 2:
switchD_018a97fc_caseD_2:
      puVar103 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar103 != (uint *)0x0) {
        puVar103[0] = 0x6c6c756e;
        puVar103[1] = 0xa2c;
LAB_018afa14:
        local_40 = puVar103 + 1;
        goto LAB_018afb79;
      }
      break;
    case 3:
switchD_018a97fc_caseD_3:
      puVar103 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar103 != (uint *)0x0) {
        bVar111 = (val->tag & 0x18) != 0;
        uVar73 = 0xa2c65736c6166;
        if (bVar111) {
          uVar73 = 0xa2c65757274;
        }
        *(undefined8 *)puVar103 = uVar73;
        local_40 = (uint *)((long)puVar103 + (5 - (ulong)bVar111));
        goto LAB_018afb79;
      }
      break;
    case 4:
switchD_018a97fc_caseD_4:
      puVar103 = (uint *)(*p_Var4)(pvVar6,0x22);
      if (puVar103 != (uint *)0x0) {
        pcVar59 = (char *)(val->uni).u64;
        uVar70 = (uint)((ulong)pcVar59 >> 0x20);
        if ((val->tag & 0x10) == 0) {
          uVar70 = uVar70 >> 0x1f & (uint)(val->tag >> 3);
          pcVar61 = (char *)-(long)pcVar59;
          if (uVar70 == 0) {
            pcVar61 = pcVar59;
          }
          *(byte *)puVar103 = 0x2d;
          pbVar81 = (byte *)((long)puVar103 + (ulong)uVar70);
          if (pcVar61 < (char *)0x5f5e100) {
            if (pcVar61 < (char *)0x64) {
              *(undefined2 *)pbVar81 =
                   *(undefined2 *)(digit_table + (ulong)(pcVar61 < (char *)0xa) + (long)pcVar61 * 2)
              ;
              pbVar81 = pbVar81 + -(ulong)(pcVar61 < (char *)0xa);
              goto LAB_018b15fc;
            }
            iVar71 = (int)pcVar61;
            if (pcVar61 < (char *)0x2710) {
              uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
              uVar84 = (ulong)(pcVar61 < (char *)0x3e8);
              *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar70 * 2);
              *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                   *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
              local_40 = (uint *)(pbVar81 + (4 - uVar84));
              goto LAB_018afb79;
            }
            if (pcVar61 < (char *)0xf4240) {
              iVar71 = (int)((ulong)((long)pcVar61 * 0x68db9) >> 0x20) * -10000 + iVar71;
              uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
              uVar84 = (ulong)(pcVar61 < (char *)0x186a0);
              *(undefined2 *)pbVar81 =
                   *(undefined2 *)
                    (digit_table + uVar84 + ((ulong)((long)pcVar61 * 0x68db9) >> 0x20) * 2);
              *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                   *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
              *(undefined2 *)(pbVar81 + (4 - uVar84)) =
                   *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
              local_40 = (uint *)(pbVar81 + (6 - uVar84));
              goto LAB_018afb79;
            }
            uVar70 = (uint)((ulong)((long)pcVar61 * 0x68db8bb) >> 0x20);
            uVar83 = uVar70 >> 8;
            iVar71 = uVar83 * -10000 + iVar71;
            uVar83 = uVar83 * 0x147b >> 0x13;
            uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
            iVar71 = uVar88 * -100 + iVar71;
            *(undefined2 *)pbVar81 =
                 *(undefined2 *)
                  (digit_table +
                  (ulong)(pcVar61 < "cSt11char_traitsIcESaIcEEEDpT_") + (ulong)uVar83 * 2);
            pbVar81 = pbVar81 + -(ulong)(pcVar61 < "cSt11char_traitsIcESaIcEEEDpT_");
            *(undefined2 *)(pbVar81 + 2) =
                 *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
            uVar69 = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
          }
          else {
            uVar84 = (ulong)pcVar61 / 100000000;
            pcVar59 = pcVar61 + uVar84 * 0xfa0a1f00;
            iVar71 = (int)uVar84;
            if ((char *)0x2386f26fc0ffff < pcVar61) {
              uVar84 = (ulong)pcVar61 / 1000000000000;
              iVar60 = (int)uVar84;
              iVar71 = iVar71 + iVar60 * -10000;
              if (pcVar61 < (char *)0xde0b6b3a7640000) {
                iVar60 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar60;
                uVar70 = (uint)(iVar60 * 0x147b) >> 0x13;
                uVar64 = (ulong)(pcVar61 < (char *)0x16345785d8a0000);
                *(undefined2 *)pbVar81 =
                     *(undefined2 *)(digit_table + uVar64 + (uVar84 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                     *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar64)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar60) * 2);
                lVar98 = 6 - uVar64;
              }
              else {
                uVar70 = (uint)(uVar84 / 10000);
                iVar60 = uVar70 * -10000 + iVar60;
                uVar70 = uVar70 / 100;
                uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                uVar64 = (ulong)(pcVar61 < (char *)0x8ac7230489e80000);
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar64 + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + (int)(uVar84 / 10000)) * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar64)) =
                     *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                *(undefined2 *)(pbVar81 + (6 - uVar64)) =
                     *(undefined2 *)(digit_table + (uVar83 * -100 + iVar60) * 2);
                lVar98 = 8 - uVar64;
              }
              pbVar81 = pbVar81 + lVar98;
              uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
              *(undefined2 *)(pbVar81 + 2) =
                   *(undefined2 *)(digit_table + (uVar70 * 0x7fffff9c + iVar71) * 2);
              uVar70 = (uint)(((ulong)pcVar59 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar83 = uVar70 >> 8;
              iVar71 = uVar83 * -10000 + (int)pcVar59;
              uVar83 = uVar83 * 0x147b >> 0x13;
              uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar81 + 4) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
              *(undefined2 *)(pbVar81 + 6) =
                   *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
              *(undefined2 *)(pbVar81 + 8) = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
              *(undefined2 *)(pbVar81 + 10) =
                   *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2);
              local_40 = (uint *)(pbVar81 + 0xc);
              goto LAB_018afb79;
            }
            if ("b13UnaryExecutor15ExecuteStandardIaaNS_20UnaryOperatorWrapperENS_14TryAbsOperatorEEEvRNS_6VectorES5_mPvbNS_14FunctionErrorsE"
                < (char *)((ulong)pcVar61 >> 10)) {
              if ((ulong)pcVar61 >> 0xc < 0xe8d4a51) {
                uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar84 = (ulong)((ulong)pcVar61 >> 0xb < 0x2e90edd);
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                pbVar81 = pbVar81 + (4 - uVar84);
              }
              else if (pcVar61 < (char *)0x5af3107a4000) {
                iVar71 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar71;
                uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar64 = (ulong)((ulong)pcVar61 >> 0xd < 0x48c27395);
                *(undefined2 *)pbVar81 =
                     *(undefined2 *)(digit_table + uVar64 + (uVar84 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar64)) =
                     *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar64)) =
                     *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                pbVar81 = pbVar81 + (6 - uVar64);
              }
              else {
                uVar70 = (uint)(uVar84 * 0x68db8bb >> 0x20);
                uVar83 = uVar70 >> 8;
                iVar71 = uVar83 * -10000 + iVar71;
                uVar83 = uVar83 * 0x147b >> 0x13;
                uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                uVar84 = (ulong)(pcVar61 < (char *)0x38d7ea4c68000);
                *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar83 * 2);
                *(undefined2 *)(pbVar81 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                *(undefined2 *)(pbVar81 + (4 - uVar84)) =
                     *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                *(undefined2 *)(pbVar81 + (6 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                pbVar81 = pbVar81 + (8 - uVar84);
              }
            }
            else {
              *(undefined2 *)pbVar81 =
                   *(undefined2 *)(digit_table + (ulong)(pcVar61 < (char *)0x3b9aca00) + uVar84 * 2)
              ;
              pbVar81 = pbVar81 + (2 - (ulong)(pcVar61 < (char *)0x3b9aca00));
            }
            uVar70 = (uint)(((ulong)pcVar59 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar83 = uVar70 >> 8;
            iVar71 = uVar83 * -10000 + (int)pcVar59;
            uVar83 = uVar83 * 0x147b >> 0x13;
            uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
            iVar71 = uVar88 * 0x7fffff9c + iVar71;
            *(undefined2 *)pbVar81 = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
            *(undefined2 *)(pbVar81 + 2) =
                 *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
            uVar69 = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
          }
          *(undefined2 *)(pbVar81 + 4) = uVar69;
          *(undefined2 *)(pbVar81 + 6) = *(undefined2 *)(digit_table + (uint)(iVar71 * 2));
          local_40 = (uint *)(pbVar81 + 8);
        }
        else {
          uVar84 = (ulong)pcVar59 & 0xfffffffffffff;
          uVar70 = uVar70 >> 0x14 & 0x7ff;
          if (uVar70 == 0x7ff) {
            if ((flg & 0x10) == 0) {
              if ((flg & 8) != 0) {
                if (uVar84 == 0) {
                  *(byte *)puVar103 = 0x2d;
                  lVar98 = -((long)pcVar59 >> 0x3f);
                  *(undefined8 *)((long)puVar103 + lVar98) = 0x7974696e69666e49;
                  local_40 = (uint *)((long)puVar103 + lVar98 + 8);
                }
                else {
                  *puVar103 = 0x4e614e;
                  local_40 = (uint *)((long)puVar103 + 3);
                }
                goto LAB_018afb79;
              }
              (*p_Var5)(pvVar6,puVar103);
              if (dat_len != (usize *)0x0) {
                *dat_len = 0;
              }
              pyVar67 = &local_60;
              if (err != (yyjson_write_err *)0x0) {
                pyVar67 = err;
              }
              pyVar68->code = 4;
              pcVar59 = "nan or inf number is not allowed";
              goto LAB_018afbdd;
            }
            *puVar103 = 0x6c6c756e;
            goto LAB_018afa14;
          }
          *(byte *)puVar103 = 0x2d;
          lVar98 = -((long)pcVar59 >> 0x3f);
          puVar105 = (undefined8 *)(lVar98 + (long)puVar103);
          if (((ulong)pcVar59 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar105 = 0x302e30;
            local_40 = (uint *)((long)puVar105 + 3);
            goto LAB_018afb79;
          }
          if (uVar70 == 0) {
            yyjson_mut_write_opts_impl();
            goto LAB_018afb79;
          }
          uVar64 = uVar84 + 0x10000000000000;
          if (uVar70 - 0x3ff < 0x35) {
            lVar82 = 0;
            if (uVar64 != 0) {
              for (; (uVar64 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
              }
            }
            if (0x433 - uVar70 <= (uint)lVar82) {
              pcVar59 = (char *)(uVar64 >> ((byte)(0x433 - uVar70) & 0x3f));
              iVar71 = (int)pcVar59;
              if (pcVar59 < (char *)0x5f5e100) {
                if (pcVar59 < (char *)0x64) {
                  *(undefined2 *)puVar105 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar59 < (char *)0xa) + (long)pcVar59 * 2);
                  pbVar81 = (byte *)((long)puVar105 + (2 - (ulong)(pcVar59 < (char *)0xa)));
                }
                else if (pcVar59 < (char *)0x2710) {
                  uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                  uVar84 = (ulong)(pcVar59 < (char *)0x3e8);
                  *(undefined2 *)puVar105 =
                       *(undefined2 *)(digit_table + uVar84 + (ulong)uVar70 * 2);
                  *(undefined2 *)((long)puVar105 + (2 - uVar84)) =
                       *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                  pbVar81 = (byte *)((long)puVar105 + (4 - uVar84));
                }
                else if (pcVar59 < (char *)0xf4240) {
                  iVar71 = (int)((ulong)((long)pcVar59 * 0x68db9) >> 0x20) * -10000 + iVar71;
                  uVar70 = (uint)(iVar71 * 0x147b) >> 0x13;
                  uVar84 = (ulong)(pcVar59 < (char *)0x186a0);
                  *(undefined2 *)puVar105 =
                       *(undefined2 *)
                        (digit_table + uVar84 + ((ulong)((long)pcVar59 * 0x68db9) >> 0x20) * 2);
                  *(undefined2 *)((long)puVar105 + (2 - uVar84)) =
                       *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                  *(undefined2 *)((long)puVar105 + (4 - uVar84)) =
                       *(undefined2 *)(digit_table + (uVar70 * -100 + iVar71) * 2);
                  pbVar81 = (byte *)((long)puVar105 + (6 - uVar84));
                }
                else {
                  uVar70 = (uint)((ulong)((long)pcVar59 * 0x68db8bb) >> 0x20);
                  uVar83 = uVar70 >> 8;
                  iVar71 = uVar83 * -10000 + iVar71;
                  uVar83 = uVar83 * 0x147b >> 0x13;
                  uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                  uVar84 = (ulong)(pcVar59 < "cSt11char_traitsIcESaIcEEEDpT_");
                  *(undefined2 *)puVar105 =
                       *(undefined2 *)(digit_table + uVar84 + (ulong)uVar83 * 2);
                  *(undefined2 *)((long)puVar105 + (2 - uVar84)) =
                       *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar70 >> 8)) * 2);
                  *(undefined2 *)((long)puVar105 + (4 - uVar84)) =
                       *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                  *(undefined2 *)((long)puVar105 + (6 - uVar84)) =
                       *(undefined2 *)(digit_table + (uVar88 * -100 + iVar71) * 2);
                  pbVar81 = (byte *)((long)puVar105 + (8 - uVar84));
                }
              }
              else {
                auVar29._8_8_ = 0;
                auVar29._0_8_ = pcVar59;
                uVar84 = SUB168(auVar29 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                iVar60 = (int)uVar84;
                uVar70 = iVar60 * -100000000 + iVar71;
                if ("b13UnaryExecutor15ExecuteStandardIaaNS_20UnaryOperatorWrapperENS_14TryAbsOperatorEEEvRNS_6VectorES5_mPvbNS_14FunctionErrorsE"
                    < (char *)((ulong)pcVar59 >> 10)) {
                  if ((ulong)pcVar59 >> 0xc < 0xe8d4a51) {
                    uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar84 = (ulong)((ulong)pcVar59 >> 0xb < 0x2e90edd);
                    *(undefined2 *)puVar105 =
                         *(undefined2 *)(digit_table + uVar84 + (ulong)uVar83 * 2);
                    *(undefined2 *)((long)puVar105 + (2 - uVar84)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + iVar60) * 2);
                    puVar90 = (undefined2 *)((long)puVar105 + (4 - uVar84));
                  }
                  else if (pcVar59 < (char *)0x5af3107a4000) {
                    iVar60 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar60;
                    uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar64 = (ulong)((ulong)pcVar59 >> 0xd < 0x48c27395);
                    *(undefined2 *)puVar105 =
                         *(undefined2 *)(digit_table + uVar64 + (uVar84 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)((long)puVar105 + (2 - uVar64)) =
                         *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)((long)puVar105 + (4 - uVar64)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + iVar60) * 2);
                    puVar90 = (undefined2 *)((long)puVar105 + (6 - uVar64));
                  }
                  else {
                    uVar83 = (uint)(uVar84 * 0x68db8bb >> 0x20);
                    uVar88 = uVar83 >> 8;
                    iVar60 = uVar88 * -10000 + iVar60;
                    uVar88 = uVar88 * 0x147b >> 0x13;
                    uVar93 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar84 = (ulong)(pcVar59 < (char *)0x38d7ea4c68000);
                    *(undefined2 *)puVar105 =
                         *(undefined2 *)(digit_table + uVar84 + (ulong)uVar88 * 2);
                    *(undefined2 *)((long)puVar105 + (2 - uVar84)) =
                         *(undefined2 *)(digit_table + (uVar88 * -100 + (uVar83 >> 8)) * 2);
                    *(undefined2 *)((long)puVar105 + (4 - uVar84)) =
                         *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                    *(undefined2 *)((long)puVar105 + (6 - uVar84)) =
                         *(undefined2 *)(digit_table + (uVar93 * -100 + iVar60) * 2);
                    puVar90 = (undefined2 *)((long)puVar105 + (8 - uVar84));
                  }
                }
                else {
                  *(undefined2 *)puVar105 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar59 < (char *)0x3b9aca00) + uVar84 * 2);
                  puVar90 = (undefined2 *)
                            ((long)puVar105 + (2 - (ulong)(pcVar59 < (char *)0x3b9aca00)));
                }
                uVar83 = (uint)((ulong)uVar70 * 0x68db8bb >> 0x20);
                uVar88 = uVar83 >> 8;
                iVar71 = uVar88 * -10000 + uVar70;
                uVar70 = uVar88 * 0x147b >> 0x13;
                uVar88 = (uint)(iVar71 * 0x147b) >> 0x13;
                *puVar90 = *(undefined2 *)(digit_table + (ulong)uVar70 * 2);
                puVar90[1] = *(undefined2 *)(digit_table + (uVar70 * -100 + (uVar83 >> 8)) * 2);
                puVar90[2] = *(undefined2 *)(digit_table + (ulong)uVar88 * 2);
                puVar90[3] = *(undefined2 *)(digit_table + (uVar88 * 0x7fffff9c + iVar71) * 2);
                pbVar81 = (byte *)(puVar90 + 4);
              }
              pbVar81[0] = 0x2e;
              pbVar81[1] = 0x30;
              goto LAB_018b15fc;
            }
          }
          uVar108 = (ulong)((uint)pcVar59 & 1);
          iVar71 = uVar70 * 0x4d105 + -0x200a5;
          if (uVar70 == 1 || uVar84 != 0) {
            iVar71 = uVar70 * 0x4d105;
          }
          iVar71 = iVar71 + -0x1439b7ff >> 0x14;
          uVar101 = *(ulong *)(pow10_sig_table + (ulong)(iVar71 * -2 + 0x2ae) * 8);
          uVar79 = *(long *)(pow10_sig_table + (ulong)(iVar71 * -2 + 0x2af) * 8) +
                   (ulong)(iVar71 - 1U < 0xffffffc8);
          bVar78 = ((char)((uint)(iVar71 * -0x3526b) >> 0x10) + (char)uVar70) - 0x32;
          uVar84 = (ulong)(uVar70 != 1 && uVar84 == 0) + uVar64 * 4 + -2 << (bVar78 & 0x3f);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar79;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar84;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = SUB168(auVar23 * auVar42,8);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar101;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar84;
          auVar54 = auVar24 * auVar43 + auVar54;
          uVar84 = uVar64 * 4 << (bVar78 & 0x3f);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar79;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar84;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = SUB168(auVar25 * auVar44,8);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar101;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar84;
          auVar55 = auVar26 * auVar45 + auVar55;
          uVar84 = auVar55._8_8_;
          uVar64 = uVar64 * 4 + 2 << (bVar78 & 0x3f);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar79;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar64;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = SUB168(auVar27 * auVar46,8);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar101;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar64;
          auVar56 = auVar28 * auVar47 + auVar56;
          uVar64 = ((ulong)((auVar54 & (undefined1  [16])0xfffffffffffffffe) !=
                           (undefined1  [16])0x0) | auVar54._8_8_) + uVar108;
          uVar108 = ((ulong)((auVar56 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar56._8_8_) - uVar108;
          if (uVar84 < 0x28) {
LAB_018afdbe:
            uVar79 = (auVar55 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                     uVar84;
            uVar101 = uVar84 & 0xfffffffffffffffc;
            bVar111 = true;
            if (uVar79 <= uVar101 + 2) {
              bVar111 = (bool)((byte)(uVar84 >> 2) & 0x3f & uVar79 == uVar101 + 2);
            }
            bVar110 = uVar101 + 4 <= uVar108;
            if (uVar101 < uVar64 == bVar110) {
              bVar111 = bVar110;
            }
            uVar84 = (uVar84 >> 2) + (ulong)bVar111;
          }
          else {
            uVar79 = uVar84 / 0x28;
            uVar101 = uVar79 * 0x28 + 0x28;
            if (uVar79 * 0x28 < uVar64 != uVar101 <= uVar108) goto LAB_018afdbe;
            uVar84 = (uVar79 + 1) - (ulong)(uVar108 < uVar101);
            iVar71 = iVar71 + 1;
          }
          iVar91 = (0x11 - (uint)(uVar84 < 10000000000000000)) - (uint)(uVar84 < 1000000000000000);
          uVar70 = iVar91 + iVar71;
          uVar64 = uVar84 / 100000000;
          uVar84 = uVar64 * 0xfa0a1f00 + uVar84;
          uVar83 = (uint)uVar64;
          iVar106 = (int)((uVar64 & 0xffffffff) / 10000);
          iVar89 = iVar106 * -10000 + uVar83;
          iVar60 = (int)(((uVar64 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
          uVar96 = (uint)(iVar60 * 0x29) >> 0xc;
          uVar93 = uVar96 * -100 + iVar60;
          uVar88 = iVar60 * -100 + iVar106;
          cVar95 = (char)uVar96 + '0';
          iVar60 = (int)uVar84;
          if (iVar91 + iVar71 + 5U < 0x1b) {
            if ((int)uVar70 < 1) {
              puVar90 = (undefined2 *)
                        ((long)puVar105 + (((ulong)(2 - uVar70) + 1) - (ulong)(uVar83 < 100000000)))
              ;
              *(char *)((long)puVar105 + (ulong)(2 - uVar70)) = cVar95;
              uVar64 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
              *puVar90 = *(undefined2 *)(digit_table + uVar64 + uVar93 * 2);
              *(undefined2 *)((long)puVar90 + (2 - uVar64)) =
                   *(undefined2 *)(digit_table + uVar88 * 2);
              if (iVar60 == 0) {
                if (iVar89 == 0) {
                  uVar83 = 0;
                  if (uVar88 == 0) {
                    uVar83 = (uint)(byte)dec_trailing_zero_table[uVar93];
                  }
                  uVar83 = 4 - (uVar83 + (byte)dec_trailing_zero_table[uVar88]);
                }
                else {
                  uVar83 = (uint)(iVar89 * 0x147b) >> 0x13;
                  uVar88 = uVar83 * -100 + iVar89;
                  *(undefined2 *)((long)puVar90 + (4 - uVar64)) =
                       *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                  *(undefined2 *)((long)puVar90 + (6 - uVar64)) =
                       *(undefined2 *)(digit_table + uVar88 * 2);
                  uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
                  if (uVar88 != 0) {
                    uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                  }
                  uVar83 = 8 - uVar83;
                }
              }
              else {
                uVar96 = (uint)(iVar89 * 0x147b) >> 0x13;
                uVar83 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar88 = uVar83 >> 8;
                uVar93 = uVar88 * 0x147b >> 0x13;
                uVar84 = (ulong)uVar93;
                uVar93 = uVar93 * -100 + (uVar83 >> 8);
                *(undefined2 *)((long)puVar90 + (4 - uVar64)) =
                     *(undefined2 *)(digit_table + (ulong)uVar96 * 2);
                *(undefined2 *)((long)puVar90 + (6 - uVar64)) =
                     *(undefined2 *)(digit_table + (uVar96 * 0x7fffff9c + iVar89) * 2);
                *(undefined2 *)((long)puVar90 + (8 - uVar64)) =
                     *(undefined2 *)(digit_table + uVar84 * 2);
                *(undefined2 *)((long)puVar90 + (10 - uVar64)) =
                     *(undefined2 *)(digit_table + uVar93 * 2);
                iVar60 = uVar88 * -10000 + iVar60;
                if (iVar60 == 0) {
                  iVar71 = 0xc;
                }
                else {
                  uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar84 = (ulong)uVar83;
                  uVar93 = uVar83 * -100 + iVar60;
                  *(undefined2 *)((long)puVar90 + (0xc - uVar64)) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  *(undefined2 *)((long)puVar90 + (0xe - uVar64)) =
                       *(undefined2 *)(digit_table + uVar93 * 2);
                  iVar71 = 0x10;
                }
                uVar83 = (byte)dec_trailing_zero_table[uVar84] + 2;
                if (uVar93 != 0) {
                  uVar83 = (uint)(byte)dec_trailing_zero_table[uVar93];
                }
                uVar83 = iVar71 - uVar83;
              }
              local_40 = (uint *)((long)puVar90 + (uVar83 - uVar64));
              *(undefined2 *)puVar105 = 0x2e30;
              if ((int)uVar70 < 0) {
                switchD_012e5a64::default((undefined2 *)((long)puVar105 + 2),0x30,(ulong)-uVar70);
              }
            }
            else {
              puVar90 = (undefined2 *)((long)puVar105 + (2 - (ulong)(uVar83 < 100000000)));
              *puVar105 = 0x3030303030303030;
              puVar105[1] = 0x3030303030303030;
              puVar105[2] = 0x3030303030303030;
              *(char *)((long)puVar105 + 1) = cVar95;
              uVar64 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
              *puVar90 = *(undefined2 *)(digit_table + uVar64 + uVar93 * 2);
              *(undefined2 *)((long)puVar90 + (2 - uVar64)) =
                   *(undefined2 *)(digit_table + uVar88 * 2);
              if (iVar60 == 0) {
                if (iVar89 == 0) {
                  uVar83 = 0;
                  if (uVar88 == 0) {
                    uVar83 = (uint)(byte)dec_trailing_zero_table[uVar93];
                  }
                  uVar83 = uVar83 + (byte)dec_trailing_zero_table[uVar88];
                  iVar71 = 4;
                }
                else {
                  uVar83 = (uint)(iVar89 * 0x147b) >> 0x13;
                  uVar88 = uVar83 * -100 + iVar89;
                  *(undefined2 *)((long)puVar90 + (4 - uVar64)) =
                       *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                  *(undefined2 *)((long)puVar90 + (6 - uVar64)) =
                       *(undefined2 *)(digit_table + uVar88 * 2);
                  uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
                  if (uVar88 != 0) {
                    uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                  }
                  iVar71 = 8;
                }
                uVar83 = iVar71 - uVar83;
              }
              else {
                uVar93 = (uint)(iVar89 * 0x147b) >> 0x13;
                uVar83 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar96 = uVar83 >> 8;
                uVar88 = uVar96 * 0x147b >> 0x13;
                uVar84 = (ulong)uVar88;
                uVar88 = uVar88 * -100 + (uVar83 >> 8);
                *(undefined2 *)((long)puVar90 + (4 - uVar64)) =
                     *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
                *(undefined2 *)((long)puVar90 + (6 - uVar64)) =
                     *(undefined2 *)(digit_table + (uVar93 * 0x7fffff9c + iVar89) * 2);
                *(undefined2 *)((long)puVar90 + (8 - uVar64)) =
                     *(undefined2 *)(digit_table + uVar84 * 2);
                *(undefined2 *)((long)puVar90 + (10 - uVar64)) =
                     *(undefined2 *)(digit_table + uVar88 * 2);
                iVar60 = uVar96 * -10000 + iVar60;
                if (iVar60 == 0) {
                  iVar71 = 0xc;
                }
                else {
                  uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar84 = (ulong)uVar83;
                  uVar88 = uVar83 * -100 + iVar60;
                  *(undefined2 *)((long)puVar90 + (0xc - uVar64)) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  *(undefined2 *)((long)puVar90 + (0xe - uVar64)) =
                       *(undefined2 *)(digit_table + uVar88 * 2);
                  iVar71 = 0x10;
                }
                uVar83 = (byte)dec_trailing_zero_table[uVar84] + 2;
                if (uVar88 != 0) {
                  uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
                }
                uVar83 = iVar71 - uVar83;
              }
              puVar75 = (uint *)((long)puVar90 + (uVar83 - uVar64));
              uVar84 = 0;
              do {
                *(byte *)((long)puVar103 + uVar84 + lVar98) =
                     *(byte *)((long)puVar103 + uVar84 + lVar98 + 1);
                uVar84 = uVar84 + 1;
              } while (uVar70 != uVar84);
              puVar100 = (undefined1 *)((long)puVar105 + (ulong)uVar70);
              local_40 = (uint *)(puVar100 + 2);
              *puVar100 = 0x2e;
              if (local_40 < puVar75) {
                local_40 = puVar75;
              }
            }
            goto LAB_018afb79;
          }
          lVar98 = 2 - (ulong)(uVar83 < 100000000);
          *(char *)((long)puVar105 + 1) = cVar95;
          uVar64 = (ulong)(uVar93 < 10 && uVar83 < 100000000);
          *(undefined2 *)((long)puVar105 + lVar98) =
               *(undefined2 *)(digit_table + uVar64 + uVar93 * 2);
          lVar98 = lVar98 - uVar64;
          *(undefined2 *)((long)puVar105 + lVar98 + 2) = *(undefined2 *)(digit_table + uVar88 * 2);
          if (iVar60 == 0) {
            if (iVar89 == 0) {
              uVar83 = 0;
              if (uVar88 == 0) {
                uVar83 = (uint)(byte)dec_trailing_zero_table[uVar93];
              }
              uVar83 = uVar83 + (byte)dec_trailing_zero_table[uVar88];
              iVar71 = 4;
            }
            else {
              uVar83 = (uint)(iVar89 * 0x147b) >> 0x13;
              uVar88 = uVar83 * -100 + iVar89;
              *(undefined2 *)((long)puVar105 + lVar98 + 4) =
                   *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
              *(undefined2 *)((long)puVar105 + lVar98 + 6) =
                   *(undefined2 *)(digit_table + uVar88 * 2);
              uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
              if (uVar88 != 0) {
                uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
              }
              iVar71 = 8;
            }
            uVar83 = iVar71 - uVar83;
          }
          else {
            uVar96 = (uint)(iVar89 * 0x147b) >> 0x13;
            uVar83 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar97 = uVar83 >> 8;
            uVar93 = uVar97 * 0x147b >> 0x13;
            uVar88 = uVar93 * -100 + (uVar83 >> 8);
            *(undefined2 *)((long)puVar105 + lVar98 + 4) =
                 *(undefined2 *)(digit_table + (ulong)uVar96 * 2);
            *(undefined2 *)((long)puVar105 + lVar98 + 6) =
                 *(undefined2 *)(digit_table + (uVar96 * 0x7fffff9c + iVar89) * 2);
            *(undefined2 *)((long)puVar105 + lVar98 + 8) =
                 *(undefined2 *)(digit_table + (ulong)uVar93 * 2);
            *(undefined2 *)((long)puVar105 + lVar98 + 10) =
                 *(undefined2 *)(digit_table + uVar88 * 2);
            iVar60 = uVar97 * -10000 + iVar60;
            if (iVar60 == 0) {
              uVar83 = (byte)dec_trailing_zero_table[uVar93] + 2;
              if (uVar88 != 0) {
                uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
              }
              uVar83 = 0xc - uVar83;
            }
            else {
              uVar83 = (uint)(iVar60 * 0x147b) >> 0x13;
              uVar88 = uVar83 * -100 + iVar60;
              *(undefined2 *)((long)puVar105 + lVar98 + 0xc) =
                   *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
              *(undefined2 *)((long)puVar105 + lVar98 + 0xe) =
                   *(undefined2 *)(digit_table + uVar88 * 2);
              uVar83 = (byte)dec_trailing_zero_table[uVar83] + 2;
              if (uVar88 != 0) {
                uVar83 = (uint)(byte)dec_trailing_zero_table[uVar88];
              }
              uVar83 = 0x10 - uVar83;
            }
          }
          puVar90 = (undefined2 *)
                    ((long)puVar105 +
                    (((ulong)uVar83 + lVar98) - (ulong)((ulong)uVar83 + lVar98 == 2)));
          uVar70 = uVar70 - 1;
          *(undefined1 *)puVar105 = *(undefined1 *)((long)puVar105 + 1);
          *(undefined1 *)((long)puVar105 + 1) = 0x2e;
          *puVar90 = 0x2d65;
          uVar88 = uVar70 >> 0x1f;
          pcVar59 = (char *)((long)puVar90 + (ulong)uVar88 + 1);
          uVar83 = -uVar70;
          if (0 < (int)uVar70) {
            uVar83 = uVar70;
          }
          if (99 < uVar83) {
            *pcVar59 = (char)(uVar83 * 0x290 >> 0x10) + '0';
            *(undefined2 *)((long)puVar90 + (ulong)uVar88 + 2) =
                 *(undefined2 *)(digit_table + ((uVar83 * 0x290 >> 0x10) * 0x7fffff9c + uVar83) * 2)
            ;
            local_40 = (uint *)((long)puVar90 + (ulong)uVar88 + 4);
            goto LAB_018afb79;
          }
          *(undefined2 *)pcVar59 =
               *(undefined2 *)(digit_table + (ulong)(uVar83 < 10) + (ulong)uVar83 * 2);
          pbVar81 = (byte *)(pcVar59 + -(ulong)(uVar83 < 10));
LAB_018b15fc:
          local_40 = (uint *)(pbVar81 + 2);
        }
LAB_018afb79:
        if (local_fc < '\0') {
          *(byte *)local_40 = 10;
          local_40 = (uint *)((long)local_40 + 1);
        }
        *(byte *)local_40 = 0;
        if (dat_len != (usize *)0x0) {
          *dat_len = (long)local_40 - (long)puVar103;
        }
        *(undefined8 *)pyVar68 = 0;
        pyVar68->msg = (char *)0x0;
        return (char *)puVar103;
      }
      break;
    case 5:
switchD_018a97fc_caseD_5:
      uVar64 = uVar84 >> 8;
      puVar75 = (uint *)(val->uni).str;
      puVar103 = (uint *)(*p_Var4)(pvVar6,uVar64 * 6 + 4);
      if (puVar103 != (uint *)0x0) {
        if (puVar100 != enc_table_cpy) {
          puVar62 = (uint *)(uVar64 + (long)puVar75);
          *(byte *)puVar103 = 0x22;
          puVar80 = puVar103;
LAB_018b1655:
          lVar98 = (long)puVar62 - (long)puVar75;
          if (0xf < lVar98) {
            lVar82 = 0;
            do {
              local_40 = (uint *)((long)puVar80 + lVar82 + 1);
              puVar57 = (uint *)(lVar82 + (long)puVar75);
              bVar78 = *(byte *)((long)puVar75 + lVar82);
              if (puVar100[bVar78] != '\0') goto LAB_018b188d;
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 1)] != '\0') {
                local_40 = (uint *)((long)puVar80 + lVar82 + 1);
                puVar57 = (uint *)((long)puVar75 + lVar82);
                goto LAB_018b183c;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 2)] != '\0') {
                local_40 = (uint *)((long)puVar80 + lVar82 + 1);
                puVar57 = (uint *)((long)puVar75 + lVar82);
                goto LAB_018b1851;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 3)] != '\0') {
                local_40 = (uint *)((long)puVar80 + lVar82 + 1);
                puVar57 = (uint *)((long)puVar75 + lVar82);
                goto LAB_018b186e;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 4)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar82 + (long)puVar75) + 4);
                local_40 = (uint *)((long)puVar80 + lVar82 + 5);
                *(undefined4 *)((long)puVar80 + lVar82 + 1) =
                     *(undefined4 *)(lVar82 + (long)puVar75);
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 5)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 5);
                local_40 = (uint *)((long)puVar80 + lVar82 + 6);
                *(byte *)((long)local_40 + -1) = pbVar81[4];
                *(undefined4 *)((long)local_40 + -5) = *(undefined4 *)pbVar81;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 6)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 6);
                local_40 = (uint *)((long)puVar80 + lVar82 + 7);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar81 + 4);
                *(undefined4 *)((long)local_40 + -6) = *(undefined4 *)pbVar81;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 7)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 7);
                uVar3 = *(undefined4 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 8);
                *(undefined4 *)((long)puVar80 + lVar82 + 4) = *(undefined4 *)(pbVar81 + 3);
                *(undefined4 *)((long)puVar80 + lVar82 + 1) = uVar3;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 8)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar82 + (long)puVar75) + 8);
                local_40 = (uint *)((long)puVar80 + lVar82 + 9);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) =
                     *(undefined8 *)(lVar82 + (long)puVar75);
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 9)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 9);
                local_40 = (uint *)((long)puVar80 + lVar82 + 10);
                *(byte *)((long)local_40 + -1) = pbVar81[8];
                *(undefined8 *)((long)local_40 + -9) = *(undefined8 *)pbVar81;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 10)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 10);
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xb);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar81 + 8);
                *(undefined8 *)((long)local_40 + -10) = *(undefined8 *)pbVar81;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 0xb)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xb);
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xc);
                local_40[-1] = *(uint *)(pbVar81 + 7);
                *(undefined8 *)((long)local_40 + -0xb) = *(undefined8 *)pbVar81;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 0xc)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xc);
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xd);
                local_40[-1] = *(uint *)(pbVar81 + 8);
                *(undefined8 *)(local_40 + -3) = *(undefined8 *)pbVar81;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 0xd)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xd);
                uVar73 = *(undefined8 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xe);
                *(undefined8 *)((long)puVar80 + lVar82 + 6) = *(undefined8 *)(pbVar81 + 5);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) = uVar73;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 0xe)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xe);
                uVar73 = *(undefined8 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xf);
                *(undefined8 *)((long)puVar80 + lVar82 + 7) = *(undefined8 *)(pbVar81 + 6);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) = uVar73;
                goto LAB_018b188d;
              }
              if (puVar100[*(byte *)((long)puVar75 + lVar82 + 0xf)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xf);
                uVar73 = *(undefined8 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 0x10);
                *(undefined8 *)((long)puVar80 + lVar82 + 8) = *(undefined8 *)(pbVar81 + 7);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) = uVar73;
                goto LAB_018b188d;
              }
              uVar70 = puVar57[1];
              uVar83 = puVar57[2];
              uVar88 = puVar57[3];
              *local_40 = *puVar57;
              *(uint *)((long)puVar80 + lVar82 + 5) = uVar70;
              *(uint *)((long)puVar80 + lVar82 + 9) = uVar83;
              *(uint *)((long)puVar80 + lVar82 + 0xd) = uVar88;
              lVar82 = lVar82 + 0x10;
              lVar98 = lVar98 + -0x10;
            } while (0xf < lVar98);
            puVar80 = (uint *)((long)puVar80 + lVar82);
            puVar75 = (uint *)((long)puVar75 + lVar82);
          }
          local_40 = (uint *)((long)puVar80 + 1);
          puVar57 = puVar75;
          if (3 < lVar98) {
            lVar98 = (long)puVar62 - (long)puVar75;
            do {
              bVar78 = (byte)*puVar57;
              if (puVar100[bVar78] != '\0') goto LAB_018b188d;
              if (puVar100[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_018b183c;
              if (puVar100[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_018b1851;
              if (puVar100[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_018b186e;
              *local_40 = *puVar57;
              local_40 = local_40 + 1;
              puVar57 = puVar57 + 1;
              lVar98 = lVar98 + -4;
            } while (3 < lVar98);
          }
          if (puVar57 < puVar62) {
            while (uVar70 = *puVar57, puVar100[(byte)uVar70] == '\0') {
              puVar57 = (uint *)((long)puVar57 + 1);
              *(byte *)local_40 = (byte)uVar70;
              local_40 = (uint *)((long)local_40 + 1);
              if (puVar62 <= puVar57) goto LAB_018b1e5f;
            }
            goto LAB_018b188d;
          }
LAB_018b1e5f:
          *(byte *)local_40 = 0x22;
          local_40 = (uint *)((long)local_40 + 1);
          goto LAB_018afb79;
        }
        uVar58 = val->tag;
        *(byte *)puVar103 = 0x22;
        if ((uVar58 & 0x18) == 0) {
          puVar62 = (uint *)(uVar64 + (long)puVar75);
          puVar80 = puVar103;
LAB_018afe2e:
          lVar98 = (long)puVar62 - (long)puVar75;
          if (0xf < lVar98) {
            lVar82 = 0;
            do {
              local_40 = (uint *)((long)puVar80 + lVar82 + 1);
              puVar57 = (uint *)(lVar82 + (long)puVar75);
              bVar78 = *(byte *)((long)puVar75 + lVar82);
              if (enc_table_cpy[bVar78] != '\0') goto LAB_018b006e;
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 1)] != '\0') {
                local_40 = (uint *)((long)puVar80 + lVar82 + 1);
                puVar57 = (uint *)((long)puVar75 + lVar82);
                goto LAB_018b0018;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 2)] != '\0') {
                local_40 = (uint *)((long)puVar80 + lVar82 + 1);
                puVar57 = (uint *)((long)puVar75 + lVar82);
                goto LAB_018b002d;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 3)] != '\0') {
                local_40 = (uint *)((long)puVar80 + lVar82 + 1);
                puVar57 = (uint *)((long)puVar75 + lVar82);
                goto LAB_018b004a;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 4)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar82 + (long)puVar75) + 4);
                local_40 = (uint *)((long)puVar80 + lVar82 + 5);
                *(undefined4 *)((long)puVar80 + lVar82 + 1) =
                     *(undefined4 *)(lVar82 + (long)puVar75);
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 5)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 5);
                local_40 = (uint *)((long)puVar80 + lVar82 + 6);
                *(byte *)((long)local_40 + -1) = pbVar81[4];
                *(undefined4 *)((long)local_40 + -5) = *(undefined4 *)pbVar81;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 6)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 6);
                local_40 = (uint *)((long)puVar80 + lVar82 + 7);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar81 + 4);
                *(undefined4 *)((long)local_40 + -6) = *(undefined4 *)pbVar81;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 7)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 7);
                uVar3 = *(undefined4 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 8);
                *(undefined4 *)((long)puVar80 + lVar82 + 4) = *(undefined4 *)(pbVar81 + 3);
                *(undefined4 *)((long)puVar80 + lVar82 + 1) = uVar3;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 8)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar82 + (long)puVar75) + 8);
                local_40 = (uint *)((long)puVar80 + lVar82 + 9);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) =
                     *(undefined8 *)(lVar82 + (long)puVar75);
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 9)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 9);
                local_40 = (uint *)((long)puVar80 + lVar82 + 10);
                *(byte *)((long)local_40 + -1) = pbVar81[8];
                *(undefined8 *)((long)local_40 + -9) = *(undefined8 *)pbVar81;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 10)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 10);
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xb);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar81 + 8);
                *(undefined8 *)((long)local_40 + -10) = *(undefined8 *)pbVar81;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 0xb)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xb);
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xc);
                local_40[-1] = *(uint *)(pbVar81 + 7);
                *(undefined8 *)((long)local_40 + -0xb) = *(undefined8 *)pbVar81;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 0xc)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xc);
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xd);
                local_40[-1] = *(uint *)(pbVar81 + 8);
                *(undefined8 *)(local_40 + -3) = *(undefined8 *)pbVar81;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 0xd)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xd);
                uVar73 = *(undefined8 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xe);
                *(undefined8 *)((long)puVar80 + lVar82 + 6) = *(undefined8 *)(pbVar81 + 5);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) = uVar73;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 0xe)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xe);
                uVar73 = *(undefined8 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 0xf);
                *(undefined8 *)((long)puVar80 + lVar82 + 7) = *(undefined8 *)(pbVar81 + 6);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) = uVar73;
                goto LAB_018b006e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar75 + lVar82 + 0xf)] != '\0') {
                pbVar81 = (byte *)(lVar82 + (long)puVar75);
                puVar57 = (uint *)(pbVar81 + 0xf);
                uVar73 = *(undefined8 *)pbVar81;
                local_40 = (uint *)((long)puVar80 + lVar82 + 0x10);
                *(undefined8 *)((long)puVar80 + lVar82 + 8) = *(undefined8 *)(pbVar81 + 7);
                *(undefined8 *)((long)puVar80 + lVar82 + 1) = uVar73;
                goto LAB_018b006e;
              }
              uVar70 = puVar57[1];
              uVar83 = puVar57[2];
              uVar88 = puVar57[3];
              *local_40 = *puVar57;
              *(uint *)((long)puVar80 + lVar82 + 5) = uVar70;
              *(uint *)((long)puVar80 + lVar82 + 9) = uVar83;
              *(uint *)((long)puVar80 + lVar82 + 0xd) = uVar88;
              lVar82 = lVar82 + 0x10;
              lVar98 = lVar98 + -0x10;
            } while (0xf < lVar98);
            puVar80 = (uint *)((long)puVar80 + lVar82);
            puVar75 = (uint *)((long)puVar75 + lVar82);
          }
          local_40 = (uint *)((long)puVar80 + 1);
          puVar57 = puVar75;
          if (3 < lVar98) {
            lVar98 = (long)puVar62 - (long)puVar75;
            do {
              bVar78 = (byte)*puVar57;
              if (enc_table_cpy[bVar78] != '\0') goto LAB_018b006e;
              if (enc_table_cpy[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_018b0018;
              if (enc_table_cpy[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_018b002d;
              if (enc_table_cpy[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_018b004a;
              *local_40 = *puVar57;
              local_40 = local_40 + 1;
              puVar57 = puVar57 + 1;
              lVar98 = lVar98 + -4;
            } while (3 < lVar98);
          }
          if (puVar57 < puVar62) {
            while (uVar70 = *puVar57, enc_table_cpy[(byte)uVar70] == '\0') {
              puVar57 = (uint *)((long)puVar57 + 1);
              *(byte *)local_40 = (byte)uVar70;
              local_40 = (uint *)((long)local_40 + 1);
              if (puVar62 <= puVar57) goto LAB_018b0600;
            }
            goto LAB_018b006e;
          }
LAB_018b0600:
          *(byte *)local_40 = 0x22;
          local_40 = (uint *)((long)local_40 + 1);
          goto LAB_018afb79;
        }
        puVar80 = (uint *)((long)puVar103 + 1);
        if (0xfff < uVar84) {
          do {
            uVar73 = *(undefined8 *)(puVar75 + 2);
            *(undefined8 *)puVar80 = *(undefined8 *)puVar75;
            *(undefined8 *)(puVar80 + 2) = uVar73;
            puVar80 = puVar80 + 4;
            puVar75 = puVar75 + 4;
            uVar64 = uVar64 - 0x10;
          } while (0xf < uVar64);
        }
        for (; 3 < uVar64; uVar64 = uVar64 - 4) {
          *puVar80 = *puVar75;
          puVar80 = puVar80 + 1;
          puVar75 = puVar75 + 1;
        }
        if (uVar64 != 0) {
          uVar84 = 0;
          do {
            *(byte *)((long)puVar80 + uVar84) = *(byte *)((long)puVar75 + uVar84);
            uVar84 = uVar84 + 1;
          } while (uVar64 != uVar84);
          puVar80 = (uint *)((long)puVar80 + uVar84);
        }
        *(byte *)puVar80 = 0x22;
        local_40 = (uint *)((long)puVar80 + 1);
        goto LAB_018afb79;
      }
      break;
    case 6:
switchD_018a97fc_caseD_6:
      puVar103 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar103 != (uint *)0x0) {
        *(ushort *)puVar103 = 0x5d5b;
LAB_018afb6a:
        local_40 = (uint *)((long)puVar103 + 2);
        goto LAB_018afb79;
      }
      break;
    case 7:
switchD_018a97fc_caseD_7:
      puVar103 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar103 != (uint *)0x0) {
        *(ushort *)puVar103 = 0x7d7b;
        goto LAB_018afb6a;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar67 = &local_60;
    if (err != (yyjson_write_err *)0x0) {
      pyVar67 = err;
    }
    pyVar68->code = 2;
    pcVar59 = "memory allocation failed";
  }
  else {
    puVar100 = enc_table_esc_slash;
    if ((flg & 4) == 0) {
      puVar100 = enc_table_esc;
    }
    switch(bVar78 & 7) {
    case 1:
      goto switchD_018a97fc_caseD_1;
    case 2:
      goto switchD_018a97fc_caseD_2;
    case 3:
      goto switchD_018a97fc_caseD_3;
    case 4:
      goto switchD_018a97fc_caseD_4;
    case 5:
      goto switchD_018a97fc_caseD_5;
    case 6:
      goto switchD_018a97fc_caseD_6;
    case 7:
      goto switchD_018a97fc_caseD_7;
    }
switchD_018a97fc_caseD_0:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar67 = &local_60;
    if (err != (yyjson_write_err *)0x0) {
      pyVar67 = err;
    }
    pyVar68->code = 3;
    pcVar59 = "invalid JSON value type";
  }
LAB_018afbdd:
  pyVar67->msg = pcVar59;
  return (char *)0x0;
LAB_018aeccb:
  *(byte *)puVar104 = bVar78;
  puVar104 = (uint *)((long)puVar104 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018aed29;
LAB_018aece0:
  *(ushort *)puVar104 = (ushort)*puVar57;
  puVar104 = (uint *)((long)puVar104 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_018aed29;
LAB_018aecfb:
  *(byte *)((long)puVar104 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)puVar104 = (ushort)*puVar57;
  puVar104 = (uint *)((long)puVar104 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_018aed29:
  puVar103 = puVar57 + 1;
  if (puVar62 < puVar103) {
    if (puVar62 != puVar57) {
      bVar78 = (byte)*puVar57;
      uVar64 = (ulong)bVar78;
      bVar1 = puVar100[uVar64];
      if ((long)(ulong)(bVar1 >> 1) <= (long)puVar62 - (long)puVar57) goto LAB_018aed44;
switchD_018aed59_caseD_1:
      if ((flg & 2) != 0) goto LAB_018aee75;
      goto LAB_018af029;
    }
    goto switchD_018ad24c_default;
  }
  bVar78 = (byte)*puVar57;
  uVar64 = (ulong)bVar78;
  bVar1 = puVar100[uVar64];
LAB_018aed44:
  switch(bVar1) {
  case 0:
    goto switchD_018aed59_caseD_0;
  case 1:
    goto switchD_018aed59_caseD_1;
  case 2:
    *(ushort *)puVar104 = *(ushort *)(esc_single_char_table + uVar64 * 2);
    puVar104 = (uint *)((long)puVar104 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_018aed29;
  case 3:
    *puVar104 = 0x3030755c;
    *(ushort *)(puVar104 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    puVar104 = (uint *)((long)puVar104 + 6);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_018aed29;
  case 4:
    uVar2 = (ushort)*puVar57;
    bVar78 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar104 = uVar2;
      puVar104 = (uint *)((long)puVar104 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_018aed29;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_018aee75;
    *(ushort *)puVar104 = 0x755c;
    *(ushort *)((long)puVar104 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar104 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar104 = (uint *)((long)puVar104 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_018aed29;
  case 6:
    if (puVar62 < puVar103) {
      uVar2 = (ushort)*puVar57;
      bVar78 = (byte)uVar2;
      uVar70 = (uint)(uint3)*puVar57;
      if ((((uVar70 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_018aee33;
    }
    else {
      uVar70 = *puVar57;
      bVar78 = (byte)uVar70;
      if ((((uVar70 & 0xc0c0f0) == 0x8080e0) && ((uVar70 & 0x200f) != 0)) &&
         ((uVar70 & 0x200f) != 0x200d)) {
LAB_018aee33:
        *puVar104 = uVar70;
        puVar104 = (uint *)((long)puVar104 + 3);
        puVar57 = (uint *)((long)puVar57 + 3);
        goto LAB_018aed29;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar78 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar70 = *puVar57;
      *(ushort *)puVar104 = 0x755c;
      *(ushort *)((long)puVar104 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar70 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar104 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      puVar104 = (uint *)((long)puVar104 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_018aee75:
      if ((flg & 0x20) == 0) goto LAB_018af734;
      *(ushort *)puVar104 = 0x755c;
      ((ushort *)((long)puVar104 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar104 + 2))[1] = 0x4446;
      puVar104 = (uint *)((long)puVar104 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_018aed29;
  case 8:
    uVar70 = *puVar57;
    bVar78 = (byte)uVar70;
    if ((((uVar70 & 0xc0c0c0f8) == 0x808080f0) && ((uVar70 & 0x3007) != 0)) &&
       ((bVar78 >> 2 & (uVar70 & 0x3003) != 0) == 0)) {
      *puVar104 = uVar70;
      puVar104 = puVar104 + 1;
      puVar57 = puVar103;
      goto LAB_018aed29;
    }
    break;
  case 9:
    uVar70 = *puVar57;
    if ((((uVar70 & 0xc0c0c0f8) != 0x808080f0) || ((uVar70 & 0x3007) == 0)) ||
       (((byte)uVar70 >> 2 & (uVar70 & 0x3003) != 0) != 0)) goto LAB_018aee75;
    iVar71 = (uVar70 & 7) * 0x40000;
    iVar60 = (uVar70 & 0x3f00) * 0x10;
    *(ushort *)puVar104 = 0x755c;
    *(ushort *)((long)puVar104 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar71 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar104 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar70 >> 10 & 0xc00) + iVar71 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar104 + 6) = 0x755c;
    *(ushort *)(puVar104 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar104 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 10 & 0xc0 | uVar70 >> 0x18 & 0x3f) * 2);
    puVar104 = puVar104 + 3;
    puVar57 = puVar103;
    goto LAB_018aed29;
  default:
    goto switchD_018ad24c_default;
  }
LAB_018af029:
  if ((flg & 0x20) == 0) goto LAB_018af734;
  *(byte *)puVar104 = bVar78;
  puVar104 = (uint *)((long)puVar104 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018aed29;
switchD_018aed59_caseD_0:
  puVar103 = (uint *)((long)puVar57 + 1);
  *(byte *)puVar104 = bVar78;
  puVar80 = puVar104;
  goto LAB_018aeaef;
LAB_018ad1d6:
  *(byte *)puVar104 = bVar78;
  puVar104 = (uint *)((long)puVar104 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018ad221;
LAB_018ad1eb:
  *(ushort *)puVar104 = (ushort)*puVar57;
  puVar104 = (uint *)((long)puVar104 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_018ad221;
LAB_018ad206:
  *(byte *)((long)puVar104 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)puVar104 = (ushort)*puVar57;
  puVar104 = (uint *)((long)puVar104 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_018ad221:
  puVar103 = puVar57 + 1;
  if (puVar62 < puVar103) {
    if (puVar62 != puVar57) {
      bVar78 = (byte)*puVar57;
      uVar64 = (ulong)bVar78;
      bVar1 = enc_table_cpy[uVar64];
      if ((long)(ulong)(bVar1 >> 1) <= (long)puVar62 - (long)puVar57) goto LAB_018ad237;
switchD_018ad24c_caseD_1:
      if ((flg & 2) != 0) goto LAB_018ad361;
      goto LAB_018ad522;
    }
    goto switchD_018ad24c_default;
  }
  bVar78 = (byte)*puVar57;
  uVar64 = (ulong)bVar78;
  bVar1 = enc_table_cpy[uVar64];
LAB_018ad237:
  switch(bVar1) {
  case 0:
    goto switchD_018ad24c_caseD_0;
  case 1:
    goto switchD_018ad24c_caseD_1;
  case 2:
    *(ushort *)puVar104 = *(ushort *)(esc_single_char_table + uVar64 * 2);
    puVar104 = (uint *)((long)puVar104 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_018ad221;
  case 3:
    *puVar104 = 0x3030755c;
    *(ushort *)(puVar104 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    goto LAB_018ad37a;
  case 4:
    uVar2 = (ushort)*puVar57;
    bVar78 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar104 = uVar2;
      puVar104 = (uint *)((long)puVar104 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_018ad221;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_018ad361;
    *(ushort *)puVar104 = 0x755c;
    *(ushort *)((long)puVar104 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar104 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar104 = (uint *)((long)puVar104 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_018ad221;
  case 6:
    if (puVar62 < puVar103) {
      uVar2 = (ushort)*puVar57;
      bVar78 = (byte)uVar2;
      uVar70 = (uint)(uint3)*puVar57;
      if (((uVar70 & 0xc0c0f0) == 0x8080e0) &&
         (uVar88 = uVar2 & 0x200f, uVar83 = (uint)uVar2, (uVar2 & 0x200f) != 0)) goto LAB_018ad313;
    }
    else {
      uVar70 = *puVar57;
      if (((uVar70 & 0xc0c0f0) == 0x8080e0) &&
         (uVar88 = uVar70 & 0x200f, uVar83 = uVar70, uVar88 != 0)) {
LAB_018ad313:
        bVar78 = (byte)uVar83;
        if (uVar88 != 0x200d) {
          *puVar104 = uVar70;
          puVar104 = (uint *)((long)puVar104 + 3);
          puVar57 = (uint *)((long)puVar57 + 3);
          goto LAB_018ad221;
        }
      }
      else {
        bVar78 = (byte)uVar70;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar78 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar70 = *puVar57;
      *(ushort *)puVar104 = 0x755c;
      *(ushort *)((long)puVar104 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar70 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar104 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      puVar104 = (uint *)((long)puVar104 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_018ad361:
      if ((flg & 0x20) == 0) goto LAB_018af734;
      *(ushort *)puVar104 = 0x755c;
      ((ushort *)((long)puVar104 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar104 + 2))[1] = 0x4446;
LAB_018ad37a:
      puVar104 = (uint *)((long)puVar104 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_018ad221;
  case 8:
    uVar70 = *puVar57;
    bVar78 = (byte)uVar70;
    if ((((uVar70 & 0xc0c0c0f8) == 0x808080f0) && ((uVar70 & 0x3007) != 0)) &&
       ((bVar78 >> 2 & (uVar70 & 0x3003) != 0) == 0)) {
      *puVar104 = uVar70;
      puVar104 = puVar104 + 1;
      puVar57 = puVar103;
      goto LAB_018ad221;
    }
    break;
  case 9:
    uVar70 = *puVar57;
    if ((((uVar70 & 0xc0c0c0f8) != 0x808080f0) || ((uVar70 & 0x3007) == 0)) ||
       (((byte)uVar70 >> 2 & (uVar70 & 0x3003) != 0) != 0)) goto LAB_018ad361;
    iVar71 = (uVar70 & 7) * 0x40000;
    iVar60 = (uVar70 & 0x3f00) * 0x10;
    *(ushort *)puVar104 = 0x755c;
    *(ushort *)((long)puVar104 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar71 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar104 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar70 >> 10 & 0xc00) + iVar71 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar104 + 6) = 0x755c;
    *(ushort *)(puVar104 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar104 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 10 & 0xc0 | uVar70 >> 0x18 & 0x3f) * 2);
    puVar104 = puVar104 + 3;
    puVar57 = puVar103;
    goto LAB_018ad221;
  default:
    goto switchD_018ad24c_default;
  }
LAB_018ad522:
  if ((flg & 0x20) == 0) goto LAB_018af734;
  *(byte *)puVar104 = bVar78;
  puVar104 = (uint *)((long)puVar104 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018ad221;
switchD_018ad24c_caseD_0:
  puVar103 = (uint *)((long)puVar57 + 1);
  *(byte *)puVar104 = bVar78;
  puVar80 = puVar104;
  goto LAB_018ad009;
LAB_018abda9:
  *(byte *)puVar57 = bVar78;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar62 = (uint *)((long)puVar62 + 1);
  goto LAB_018abe1d;
LAB_018abdc3:
  *(ushort *)puVar57 = (ushort)*puVar62;
  puVar57 = (uint *)((long)puVar57 + 2);
  puVar62 = (uint *)((long)puVar62 + 2);
  goto LAB_018abe1d;
LAB_018abde3:
  *(byte *)((long)puVar57 + 2) = *(byte *)((long)puVar62 + 2);
  *(ushort *)puVar57 = (ushort)*puVar62;
  puVar57 = (uint *)((long)puVar57 + 3);
  puVar62 = (uint *)((long)puVar62 + 3);
LAB_018abe1d:
  puVar103 = puVar62 + 1;
  if (puVar80 < puVar103) {
    if (puVar80 != puVar62) {
      uVar88 = (uint)(byte)*puVar62;
      uVar84 = (ulong)(byte)*puVar62;
      bVar78 = *(byte *)((long)local_d0 + uVar84);
      if ((long)(ulong)(bVar78 >> 1) <= (long)puVar80 - (long)puVar62) goto LAB_018abe35;
switchD_018abe4a_caseD_1:
      if ((flg & 2) != 0) goto LAB_018abf61;
      goto LAB_018ac128;
    }
    goto switchD_018aa0f3_default;
  }
  uVar88 = (uint)(byte)*puVar62;
  uVar84 = (ulong)(byte)*puVar62;
  bVar78 = *(byte *)((long)local_d0 + uVar84);
LAB_018abe35:
  switch(bVar78) {
  case 0:
    goto switchD_018abe4a_caseD_0;
  case 1:
    goto switchD_018abe4a_caseD_1;
  case 2:
    *(ushort *)puVar57 = *(ushort *)(esc_single_char_table + uVar84 * 2);
    puVar57 = (uint *)((long)puVar57 + 2);
    puVar62 = (uint *)((long)puVar62 + 1);
    goto LAB_018abe1d;
  case 3:
    *puVar57 = 0x3030755c;
    *(ushort *)(puVar57 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar62 * 2);
    puVar57 = (uint *)((long)puVar57 + 6);
    puVar62 = (uint *)((long)puVar62 + 1);
    goto LAB_018abe1d;
  case 4:
    uVar2 = (ushort)*puVar62;
    uVar88 = (uint)uVar2;
    if (((uVar88 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar57 = uVar2;
      puVar57 = (uint *)((long)puVar57 + 2);
      puVar62 = (uint *)((long)puVar62 + 2);
      goto LAB_018abe1d;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar62;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_018abf61;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar57 = (uint *)((long)puVar57 + 6);
    puVar62 = (uint *)((long)puVar62 + 2);
    goto LAB_018abe1d;
  case 6:
    if (puVar80 < puVar103) {
      uVar2 = (ushort)*puVar62;
      uVar88 = (uint)uVar2;
      uVar93 = (uint)(uint3)*puVar62;
      if ((((uVar93 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_018abf20;
    }
    else {
      uVar93 = *puVar62;
      uVar88 = uVar93;
      if ((((uVar93 & 0xc0c0f0) == 0x8080e0) && ((uVar93 & 0x200f) != 0)) &&
         ((uVar93 & 0x200f) != 0x200d)) {
LAB_018abf20:
        *puVar57 = uVar93;
        puVar57 = (uint *)((long)puVar57 + 3);
        puVar62 = (uint *)((long)puVar62 + 3);
        goto LAB_018abe1d;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar62;
    bVar78 = *(byte *)((long)puVar62 + 2);
    if ((((*puVar62 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar88 = *puVar62;
      *(ushort *)puVar57 = 0x755c;
      *(ushort *)((long)puVar57 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar88 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar57 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar62 = (uint *)((long)puVar62 + 3);
    }
    else {
LAB_018abf61:
      if ((flg & 0x20) == 0) goto LAB_018af734;
      *(ushort *)puVar57 = 0x755c;
      ((ushort *)((long)puVar57 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar57 + 2))[1] = 0x4446;
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar62 = (uint *)((long)puVar62 + 1);
    }
    goto LAB_018abe1d;
  case 8:
    uVar88 = *puVar62;
    if ((((uVar88 & 0xc0c0c0f8) == 0x808080f0) && ((uVar88 & 0x3007) != 0)) &&
       (((byte)uVar88 >> 2 & (uVar88 & 0x3003) != 0) == 0)) {
      *puVar57 = uVar88;
      puVar57 = puVar57 + 1;
      puVar62 = puVar103;
      goto LAB_018abe1d;
    }
    break;
  case 9:
    uVar88 = *puVar62;
    if ((((uVar88 & 0xc0c0c0f8) != 0x808080f0) || ((uVar88 & 0x3007) == 0)) ||
       (((byte)uVar88 >> 2 & (uVar88 & 0x3003) != 0) != 0)) goto LAB_018abf61;
    iVar71 = (uVar88 & 7) * 0x40000;
    iVar60 = (uVar88 & 0x3f00) * 0x10;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar71 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar88 >> 10 & 0xc00) + iVar71 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar57 + 6) = 0x755c;
    *(ushort *)(puVar57 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(uVar88 >> 0x11 & 6) + 0x1b8)
    ;
    *(ushort *)((long)puVar57 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar88 >> 10 & 0xc0 | uVar88 >> 0x18 & 0x3f) * 2);
    puVar57 = puVar57 + 3;
    puVar62 = puVar103;
    goto LAB_018abe1d;
  default:
    goto switchD_018aa0f3_default;
  }
LAB_018ac128:
  if ((flg & 0x20) == 0) goto LAB_018af734;
  *(byte *)puVar57 = (byte)uVar88;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar62 = (uint *)((long)puVar62 + 1);
  goto LAB_018abe1d;
switchD_018abe4a_caseD_0:
  puVar75 = (uint *)((long)puVar62 + 1);
  *(byte *)puVar57 = (byte)uVar88;
  puVar103 = puVar57;
  goto LAB_018abb63;
LAB_018aa069:
  *(byte *)puVar57 = bVar78;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar62 = (uint *)((long)puVar62 + 1);
  goto LAB_018aa0c6;
LAB_018aa07e:
  *(ushort *)puVar57 = (ushort)*puVar62;
  puVar57 = (uint *)((long)puVar57 + 2);
  puVar62 = (uint *)((long)puVar62 + 2);
  goto LAB_018aa0c6;
LAB_018aa099:
  *(byte *)((long)puVar57 + 2) = *(byte *)((long)puVar62 + 2);
  *(ushort *)puVar57 = (ushort)*puVar62;
  puVar57 = (uint *)((long)puVar57 + 3);
  puVar62 = (uint *)((long)puVar62 + 3);
LAB_018aa0c6:
  puVar103 = puVar62 + 1;
  if (puVar80 < puVar103) {
    if (puVar80 != puVar62) {
      uVar88 = (uint)(byte)*puVar62;
      uVar84 = (ulong)(byte)*puVar62;
      bVar78 = enc_table_cpy[uVar84];
      if ((long)(ulong)(bVar78 >> 1) <= (long)puVar80 - (long)puVar62) goto LAB_018aa0de;
switchD_018aa0f3_caseD_1:
      if ((flg & 2) != 0) goto LAB_018aa203;
      goto LAB_018aa3cb;
    }
    goto switchD_018aa0f3_default;
  }
  uVar88 = (uint)(byte)*puVar62;
  uVar84 = (ulong)(byte)*puVar62;
  bVar78 = enc_table_cpy[uVar84];
LAB_018aa0de:
  switch(bVar78) {
  case 0:
    goto switchD_018aa0f3_caseD_0;
  case 1:
    goto switchD_018aa0f3_caseD_1;
  case 2:
    *(ushort *)puVar57 = *(ushort *)(esc_single_char_table + uVar84 * 2);
    puVar57 = (uint *)((long)puVar57 + 2);
    puVar62 = (uint *)((long)puVar62 + 1);
    goto LAB_018aa0c6;
  case 3:
    *puVar57 = 0x3030755c;
    *(ushort *)(puVar57 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar62 * 2);
    goto LAB_018aa219;
  case 4:
    uVar2 = (ushort)*puVar62;
    uVar88 = (uint)uVar2;
    if (((uVar88 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar57 = uVar2;
      puVar57 = (uint *)((long)puVar57 + 2);
      puVar62 = (uint *)((long)puVar62 + 2);
      goto LAB_018aa0c6;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar62;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_018aa203;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar57 = (uint *)((long)puVar57 + 6);
    puVar62 = (uint *)((long)puVar62 + 2);
    goto LAB_018aa0c6;
  case 6:
    if (puVar80 < puVar103) {
      uVar2 = (ushort)*puVar62;
      uVar88 = (uint)uVar2;
      uVar93 = (uint)(uint3)*puVar62;
      if (((uVar93 & 0xc0c0f0) == 0x8080e0) && (uVar96 = uVar2 & 0x200f, (uVar2 & 0x200f) != 0))
      goto LAB_018aa1b6;
    }
    else {
      uVar93 = *puVar62;
      uVar88 = uVar93;
      if (((uVar93 & 0xc0c0f0) == 0x8080e0) && (uVar96 = uVar93 & 0x200f, uVar96 != 0)) {
LAB_018aa1b6:
        if (uVar96 != 0x200d) {
          *puVar57 = uVar93;
          puVar57 = (uint *)((long)puVar57 + 3);
          puVar62 = (uint *)((long)puVar62 + 3);
          goto LAB_018aa0c6;
        }
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar62;
    bVar78 = *(byte *)((long)puVar62 + 2);
    if ((((*puVar62 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar88 = *puVar62;
      *(ushort *)puVar57 = 0x755c;
      *(ushort *)((long)puVar57 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar88 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar57 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar62 = (uint *)((long)puVar62 + 3);
    }
    else {
LAB_018aa203:
      if ((flg & 0x20) == 0) goto LAB_018af734;
      *(ushort *)puVar57 = 0x755c;
      ((ushort *)((long)puVar57 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar57 + 2))[1] = 0x4446;
LAB_018aa219:
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar62 = (uint *)((long)puVar62 + 1);
    }
    goto LAB_018aa0c6;
  case 8:
    uVar88 = *puVar62;
    if ((((uVar88 & 0xc0c0c0f8) == 0x808080f0) && ((uVar88 & 0x3007) != 0)) &&
       (((byte)uVar88 >> 2 & (uVar88 & 0x3003) != 0) == 0)) {
      *puVar57 = uVar88;
      puVar57 = puVar57 + 1;
      puVar62 = puVar103;
      goto LAB_018aa0c6;
    }
    break;
  case 9:
    uVar88 = *puVar62;
    if ((((uVar88 & 0xc0c0c0f8) != 0x808080f0) || ((uVar88 & 0x3007) == 0)) ||
       (((byte)uVar88 >> 2 & (uVar88 & 0x3003) != 0) != 0)) goto LAB_018aa203;
    iVar71 = (uVar88 & 7) * 0x40000;
    iVar60 = (uVar88 & 0x3f00) * 0x10;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar71 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar88 >> 10 & 0xc00) + iVar71 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar57 + 6) = 0x755c;
    *(ushort *)(puVar57 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(uVar88 >> 0x11 & 6) + 0x1b8)
    ;
    *(ushort *)((long)puVar57 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar88 >> 10 & 0xc0 | uVar88 >> 0x18 & 0x3f) * 2);
    puVar57 = puVar57 + 3;
    puVar62 = puVar103;
    goto LAB_018aa0c6;
  default:
    goto switchD_018aa0f3_default;
  }
LAB_018aa3cb:
  if ((flg & 0x20) == 0) goto LAB_018af734;
  *(byte *)puVar57 = (byte)uVar88;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar62 = (uint *)((long)puVar62 + 1);
  goto LAB_018aa0c6;
switchD_018aa0f3_caseD_0:
  puVar75 = (uint *)((long)puVar62 + 1);
  *(byte *)puVar57 = (byte)uVar88;
  puVar103 = puVar57;
  goto LAB_018a9e64;
LAB_018af828:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar67 = &local_60;
  if (err != (yyjson_write_err *)0x0) {
    pyVar67 = err;
  }
  pyVar68->code = 3;
  pcVar59 = "invalid JSON value type";
  goto LAB_018af76b;
  while( true ) {
    pyVar66 = local_68->next;
    puVar102 = puVar107 + 2;
    uVar64 = *puVar107;
    local_68 = (yyjson_mut_val *)puVar107[1];
    local_78 = uVar64 & 0xffffffffffffff01;
    puVar103 = (uint *)(pbVar81 + 3);
    pbVar81[1] = 0x2c;
    pbVar81[2] = 10;
    lVar98 = (uVar64 >> 1) - 1;
    sVar63 = uVar84;
    lVar87 = lVar85;
    if (lVar98 != 0) break;
LAB_018ac912:
    pbVar81 = (byte *)((long)puVar103 + -1);
    *(byte *)((long)puVar103 + -2) = 10;
    puVar107 = puVar102;
    uVar84 = sVar63;
    if (puVar102 <= (ulong *)((long)puVar103 + lVar87 * 4 + -1)) {
      uVar84 = sVar63 >> 1;
      if (sVar63 >> 1 <= (ulong)(lVar87 * 4)) {
        uVar84 = lVar87 * 4;
      }
      uVar84 = (uVar84 + 0xf & 0xfffffffffffffff0) + sVar63;
      pbVar109 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar63,uVar84);
      if (pbVar109 == (byte *)0x0) goto LAB_018af790;
      puVar107 = (ulong *)(pbVar109 + (uVar84 - ((long)local_90 - (long)puVar102)));
      memmove(puVar107,pbVar109 + ((long)puVar102 - (long)local_f8),(long)local_90 - (long)puVar102)
      ;
      pbVar81 = pbVar109 + ((long)pbVar81 - (long)local_f8);
      local_90 = (ulong *)(pbVar109 + uVar84);
      local_f8 = pbVar109;
    }
    lVar85 = lVar87 + -1;
    if (lVar85 != 0) {
      lVar98 = 1;
      do {
        pbVar81[0] = 0x20;
        pbVar81[1] = 0x20;
        pbVar81[2] = 0x20;
        pbVar81[3] = 0x20;
        pbVar81 = pbVar81 + lVar82;
        lVar98 = lVar98 + 1;
      } while (lVar87 != lVar98);
    }
    *pbVar81 = (char)local_78 * ' ' + 0x5d;
    if (local_90 <= puVar107) {
      pbVar109 = pbVar81 + 1;
      if (local_fc < '\0') {
        if (puVar107 <= pbVar81 + 3) {
          uVar64 = 2;
          if (2 < uVar84 >> 1) {
            uVar64 = uVar84 >> 1;
          }
          sVar77 = (uVar64 + 0xf & 0xfffffffffffffff0) + uVar84;
          pbVar81 = (byte *)(*p_Var7)(pvVar6,local_f8,uVar84,sVar77);
          if (pbVar81 == (byte *)0x0) goto LAB_018af790;
          memmove(pbVar81 + (sVar77 - ((long)local_90 - (long)puVar107)),
                  pbVar81 + ((long)puVar107 - (long)local_f8),(long)local_90 - (long)puVar107);
          pbVar109 = pbVar81 + ((long)pbVar109 - (long)local_f8);
          local_f8 = pbVar81;
        }
        *pbVar109 = 10;
        pbVar109 = pbVar109 + 1;
      }
      *pbVar109 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar109 - (long)local_f8;
      }
LAB_018b1f54:
      pyVar68->code = 0;
      pyVar68 = &local_60;
      if (err != (yyjson_write_err *)0x0) {
        pyVar68 = err;
      }
      pyVar68->msg = "success";
      return (char *)local_f8;
    }
  }
  goto LAB_018a9929;
LAB_018b183c:
  *(byte *)local_40 = bVar78;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018b188d;
LAB_018b1851:
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_018b188d;
LAB_018b186e:
  *(byte *)((long)local_40 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_018b188d:
  puVar75 = puVar57 + 1;
  if (puVar62 < puVar75) {
    if (puVar62 == puVar57) goto switchD_018b18b8_default;
    uVar70 = (uint)(byte)*puVar57;
    uVar84 = (ulong)(byte)*puVar57;
    bVar78 = puVar100[uVar84];
    if ((long)(ulong)(bVar78 >> 1) <= (long)puVar62 - (long)puVar57) goto LAB_018b18a5;
switchD_018b18b8_caseD_1:
    if ((flg & 2) != 0) goto LAB_018b19de;
    goto LAB_018b1b99;
  }
  uVar70 = (uint)(byte)*puVar57;
  uVar84 = (ulong)(byte)*puVar57;
  bVar78 = puVar100[uVar84];
LAB_018b18a5:
  switch(bVar78) {
  case 0:
    goto switchD_018b18b8_caseD_0;
  case 1:
    goto switchD_018b18b8_caseD_1;
  case 2:
    *(ushort *)local_40 = *(ushort *)(esc_single_char_table + uVar84 * 2);
    local_40 = (uint *)((long)local_40 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_018b188d;
  case 3:
    *local_40 = 0x3030755c;
    *(ushort *)(local_40 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    goto LAB_018b19fa;
  case 4:
    uVar2 = (ushort)*puVar57;
    uVar70 = (uint)uVar2;
    if (((uVar70 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)local_40 = uVar2;
      local_40 = (uint *)((long)local_40 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_018b188d;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_018b19de;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    local_40 = (uint *)((long)local_40 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_018b188d;
  case 6:
    if (puVar62 < puVar75) {
      uVar2 = (ushort)*puVar57;
      uVar70 = (uint)uVar2;
      uVar83 = (uint)(uint3)*puVar57;
      if (((uVar83 & 0xc0c0f0) == 0x8080e0) && (uVar88 = uVar2 & 0x200f, (uVar2 & 0x200f) != 0))
      goto LAB_018b1985;
    }
    else {
      uVar83 = *puVar57;
      uVar70 = uVar83;
      if (((uVar83 & 0xc0c0f0) == 0x8080e0) && (uVar88 = uVar83 & 0x200f, uVar88 != 0)) {
LAB_018b1985:
        if (uVar88 != 0x200d) {
          *local_40 = uVar83;
          local_40 = (uint *)((long)local_40 + 3);
          puVar57 = (uint *)((long)puVar57 + 3);
          goto LAB_018b188d;
        }
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar78 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar70 = *puVar57;
      *(ushort *)local_40 = 0x755c;
      *(ushort *)((long)local_40 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar70 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(local_40 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_018b19de:
      if ((flg & 0x20) == 0) goto LAB_018b1e1a;
      *(ushort *)local_40 = 0x755c;
      ((ushort *)((long)local_40 + 2))[0] = 0x4646;
      ((ushort *)((long)local_40 + 2))[1] = 0x4446;
LAB_018b19fa:
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_018b188d;
  case 8:
    uVar70 = *puVar57;
    if ((((uVar70 & 0xc0c0c0f8) == 0x808080f0) && ((uVar70 & 0x3007) != 0)) &&
       (((byte)uVar70 >> 2 & (uVar70 & 0x3003) != 0) == 0)) {
      *local_40 = uVar70;
      local_40 = local_40 + 1;
      puVar57 = puVar75;
      goto LAB_018b188d;
    }
    break;
  case 9:
    uVar70 = *puVar57;
    if ((((uVar70 & 0xc0c0c0f8) != 0x808080f0) || ((uVar70 & 0x3007) == 0)) ||
       (((byte)uVar70 >> 2 & (uVar70 & 0x3003) != 0) != 0)) goto LAB_018b19de;
    iVar71 = (uVar70 & 7) * 0x40000;
    iVar60 = (uVar70 & 0x3f00) * 0x10;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar71 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar70 >> 10 & 0xc00) - 0x10000) + iVar71 + iVar60 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)local_40 + 6) = 0x755c;
    *(ushort *)(local_40 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)local_40 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 10 & 0xc0 | uVar70 >> 0x18 & 0x3f) * 2);
    local_40 = local_40 + 3;
    puVar57 = puVar75;
    goto LAB_018b188d;
  default:
switchD_018b18b8_default:
    *(byte *)local_40 = 0x22;
    local_40 = (uint *)((long)local_40 + 1);
    goto LAB_018afb79;
  }
LAB_018b1b99:
  if ((flg & 0x20) == 0) goto LAB_018b1e1a;
  *(byte *)local_40 = (byte)uVar70;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018b188d;
switchD_018b18b8_caseD_0:
  puVar75 = (uint *)((long)puVar57 + 1);
  *(byte *)local_40 = (byte)uVar70;
  puVar80 = local_40;
  goto LAB_018b1655;
LAB_018b0018:
  *(byte *)local_40 = bVar78;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018b006e;
LAB_018b002d:
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_018b006e;
LAB_018b004a:
  *(byte *)((long)local_40 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_018b006e:
  puVar75 = puVar57 + 1;
  if (puVar62 < puVar75) {
    if (puVar62 == puVar57) goto switchD_018b009b_default;
    uVar84 = (ulong)(byte)*puVar57;
    bVar78 = enc_table_cpy[uVar84];
    if ((long)(ulong)(bVar78 >> 1) <= (long)puVar62 - (long)puVar57) goto LAB_018b0086;
switchD_018b009b_caseD_1:
    bVar78 = (byte)uVar84;
    if ((flg & 2) != 0) goto LAB_018b01bc;
    goto LAB_018b0377;
  }
  uVar84 = (ulong)(byte)*puVar57;
  bVar78 = enc_table_cpy[uVar84];
LAB_018b0086:
  switch(bVar78) {
  case 0:
    goto switchD_018b009b_caseD_0;
  case 1:
    goto switchD_018b009b_caseD_1;
  case 2:
    *(ushort *)local_40 = *(ushort *)(esc_single_char_table + uVar84 * 2);
    local_40 = (uint *)((long)local_40 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_018b006e;
  case 3:
    *local_40 = 0x3030755c;
    *(ushort *)(local_40 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    goto LAB_018b01d5;
  case 4:
    uVar2 = (ushort)*puVar57;
    bVar78 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)local_40 = uVar2;
      local_40 = (uint *)((long)local_40 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_018b006e;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_018b01bc;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    local_40 = (uint *)((long)local_40 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_018b006e;
  case 6:
    if (puVar62 < puVar75) {
      uVar2 = (ushort)*puVar57;
      bVar78 = (byte)uVar2;
      uVar70 = (uint)(uint3)*puVar57;
      if ((((uVar70 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_018b0175;
    }
    else {
      uVar70 = *puVar57;
      bVar78 = (byte)uVar70;
      if ((((uVar70 & 0xc0c0f0) == 0x8080e0) && ((uVar70 & 0x200f) != 0)) &&
         ((uVar70 & 0x200f) != 0x200d)) {
LAB_018b0175:
        *local_40 = uVar70;
        local_40 = (uint *)((long)local_40 + 3);
        puVar57 = (uint *)((long)puVar57 + 3);
        goto LAB_018b006e;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar78 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar70 = *puVar57;
      *(ushort *)local_40 = 0x755c;
      *(ushort *)((long)local_40 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar70 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(local_40 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar78 & 0x3f) * 2);
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_018b01bc:
      if ((flg & 0x20) == 0) goto LAB_018b1e1a;
      *(ushort *)local_40 = 0x755c;
      ((ushort *)((long)local_40 + 2))[0] = 0x4646;
      ((ushort *)((long)local_40 + 2))[1] = 0x4446;
LAB_018b01d5:
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_018b006e;
  case 8:
    uVar70 = *puVar57;
    bVar78 = (byte)uVar70;
    if ((((uVar70 & 0xc0c0c0f8) == 0x808080f0) && ((uVar70 & 0x3007) != 0)) &&
       (((byte)(uVar70 >> 2) & 0x3f & (uVar70 & 0x3003) != 0) == 0)) {
      *local_40 = uVar70;
      local_40 = local_40 + 1;
      puVar57 = puVar75;
      goto LAB_018b006e;
    }
    break;
  case 9:
    uVar70 = *puVar57;
    if ((((uVar70 & 0xc0c0c0f8) != 0x808080f0) || ((uVar70 & 0x3007) == 0)) ||
       (((byte)uVar70 >> 2 & (uVar70 & 0x3003) != 0) != 0)) goto LAB_018b01bc;
    iVar60 = (uVar70 & 7) * 0x40000;
    iVar71 = (uVar70 & 0x3f00) * 0x10;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar60 + iVar71) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar70 >> 10 & 0xc00) - 0x10000) + iVar60 + iVar71 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)local_40 + 6) = 0x755c;
    *(ushort *)(local_40 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)local_40 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar70 >> 10 & 0xc0 | uVar70 >> 0x18 & 0x3f) * 2);
    local_40 = local_40 + 3;
    puVar57 = puVar75;
    goto LAB_018b006e;
  default:
switchD_018b009b_default:
    *(byte *)local_40 = 0x22;
    local_40 = (uint *)((long)local_40 + 1);
    goto LAB_018afb79;
  }
LAB_018b0377:
  if ((flg & 0x20) == 0) goto LAB_018b1e1a;
  *(byte *)local_40 = bVar78;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_018b006e;
LAB_018b1e1a:
  (*p_Var5)(pvVar6,puVar103);
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar67 = &local_60;
  if (err != (yyjson_write_err *)0x0) {
    pyVar67 = err;
  }
  pyVar68->code = 7;
  pcVar59 = "invalid utf-8 encoding in string";
  goto LAB_018afbdd;
switchD_018b009b_caseD_0:
  puVar75 = (uint *)((long)puVar57 + 1);
  *(byte *)local_40 = (byte)uVar84;
  puVar80 = local_40;
  goto LAB_018afe2e;
LAB_018af734:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar67 = &local_60;
  if (err != (yyjson_write_err *)0x0) {
    pyVar67 = err;
  }
  pyVar68->code = 7;
  pcVar59 = "invalid utf-8 encoding in string";
LAB_018af76b:
  pyVar67->msg = pcVar59;
  if (local_f8 != (byte *)0x0) {
    (*p_Var5)(pvVar6,local_f8);
  }
  return (char *)0x0;
}

Assistant:

static char *yyjson_mut_write_opts_impl(const yyjson_mut_val *val,
                                        usize estimated_val_num,
                                        yyjson_write_flag flg,
                                        const yyjson_alc *alc_ptr,
                                        usize *dat_len,
                                        yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_mut_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_mut_write_pretty(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_mut_write_minify(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    }
}